

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver3L1Q_New<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,
            vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
            *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *plPair,
            vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
            *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                   *lCPair)

{
  double *this;
  double *this_00;
  double *this_01;
  double *this_02;
  double *this_03;
  double *this_04;
  double *this_05;
  double *this_06;
  double *this_07;
  double *this_08;
  double *this_09;
  double *this_10;
  double *this_11;
  size_type sVar1;
  ostream *this_12;
  reference pvVar2;
  reference pvVar3;
  Scalar *pSVar4;
  reference pvVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  Index IVar8;
  reference pvVar9;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *pCVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> PVar62;
  Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  PVar63;
  XprTypeNested local_22e8;
  Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_22e0;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_22d0;
  undefined1 local_22b8 [8];
  Matrix<double,_4,_4,_0,_4,_4> outi;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> local_2200;
  uint local_21dc;
  undefined1 local_21d8 [4];
  uint i;
  Matrix<double,_4,_4,_0,_4,_4> TP;
  double r_;
  double r33;
  double r32;
  double r31;
  double r23;
  double r22;
  double r21;
  double r13;
  double r12;
  double r11;
  double z;
  double y;
  double x;
  double local_20e0;
  uint local_20d4;
  undefined1 local_20d0 [4];
  uint numHyp;
  PolynomialSolver<double,__1> solver;
  vector<double,_std::allocator<double>_> calc_realRoots;
  undefined1 local_1fb8 [8];
  Matrix<double,_9,_1,_0,_9,_1> coeff;
  double o7_8;
  double o7_7;
  double o7_6;
  double o7_5;
  double o7_4;
  double o7_3;
  double o7_2;
  double o7_1;
  double o7_0;
  double n9_4;
  double n9_3;
  double n9_2;
  double n9_1;
  double n9_0;
  double n8_3;
  double n8_2;
  double n8_1;
  double n8_0;
  double n7_3;
  double n7_2;
  double n7_1;
  double n7_0;
  double n6_3;
  double n6_2;
  double n6_1;
  double n6_0;
  double n5_2;
  double n5_1;
  double n5_0;
  double n4_2;
  double n4_1;
  double n4_0;
  double n3_3;
  double n3_2;
  double n3_1;
  double n3_0;
  double n2_2;
  double n2_1;
  double n2_0;
  double n1_2;
  double n1_1;
  double n1_0;
  double m9_2;
  double m9_1;
  double m9_0;
  double m8_1;
  double m8_0;
  double m7_1;
  double m7_0;
  double m6_2;
  double m6_1;
  double m6_0;
  double m5_1;
  double m5_0;
  double m4_1;
  double m4_0;
  double m3_2;
  double m3_1;
  double m3_0;
  double m2_1;
  double m2_0;
  double m1_1;
  double m1_0;
  double k3_9;
  double k3_8;
  double k3_7;
  double k3_6;
  double k3_5;
  double k3_4;
  double k3_3;
  double k3_2;
  double k3_1;
  double k3_0;
  double k2_9;
  double k2_8;
  double k2_7;
  double k2_6;
  double k2_5;
  double k2_4;
  double k2_3;
  double k2_2;
  double k2_1;
  double k2_0;
  double k1_9;
  double k1_8;
  double k1_7;
  double k1_6;
  double k1_5;
  double k1_4;
  double k1_3;
  double k1_2;
  double k1_1;
  double k1_0;
  double m36;
  double m35;
  double m34;
  double m33;
  double m32;
  double m31;
  double m26;
  double m25;
  double m24;
  double m23;
  double m22;
  double m21;
  double m16;
  double m15;
  double m14;
  double m13;
  double m12;
  double m11;
  double l36;
  double l35;
  double l34;
  double l33;
  double l32;
  double l31;
  double l26;
  double l25;
  double l24;
  double l23;
  double l22;
  double l21;
  double l16;
  double l15;
  double l14;
  double l13;
  double l12;
  double l11;
  RhsNested local_1b60;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> local_1b58;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> local_1b48;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> local_1b38;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> local_1b28;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> local_1b18;
  undefined1 local_1b08 [8];
  Matrix<double,_6,_1,_0,_6,_1> M3_1;
  Matrix<double,_6,_1,_0,_6,_1> M2_1;
  Matrix<double,_6,_1,_0,_6,_1> M1_1;
  Matrix<double,_6,_1,_0,_6,_1> L3_1;
  Matrix<double,_6,_1,_0,_6,_1> L2_1;
  Matrix<double,_6,_1,_0,_6,_1> L1_1;
  Type local_19b0;
  ColXpr local_1978;
  Type local_1948;
  Matrix<double,_3,_1,_0,_3,_1> local_18e8;
  Matrix<double,_3,_3,_0,_3,_3> local_18d0;
  int local_1884;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_1880;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_1858;
  Type local_17f8;
  Type local_17c0;
  Type local_1788;
  Type local_1750;
  Type local_1718;
  Type local_16e0;
  ColXpr local_16a8;
  Type local_1678;
  Matrix<double,_3,_1,_0,_3,_1> local_1618;
  Matrix<double,_3,_3,_0,_3,_3> local_1600;
  int local_15b4;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_15b0;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_1588;
  Type local_1528;
  Type local_14f0;
  Type local_14b8;
  Type local_1480;
  undefined1 local_1448 [8];
  Matrix<double,_6,_6,_0,_6,_6> transLineV;
  Matrix<double,_6,_6,_0,_6,_6> transLineU;
  Matrix<double,_4,_4,_0,_4,_4> TU;
  Matrix<double,_4,_4,_0,_4,_4> TV;
  Matrix<double,_4,_1,_0,_4,_1> local_10e8;
  undefined1 local_10c8 [8];
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  predTrans;
  RealScalar local_1078;
  Type local_1070;
  type local_1038;
  Type local_1020;
  undefined1 local_fe8 [8];
  Matrix<double,_6,_1,_0,_6,_1> M3;
  Type local_fa0;
  RealScalar local_f68;
  Type local_f60;
  type local_f28;
  Type local_f10;
  undefined1 local_ed8 [8];
  Matrix<double,_6,_1,_0,_6,_1> M2;
  Type local_e90;
  RealScalar local_e58;
  Type local_e50;
  type local_e18;
  Type local_e00;
  undefined1 local_dc8 [8];
  Matrix<double,_6,_1,_0,_6,_1> M1;
  Type local_d80;
  RealScalar local_d48;
  Type local_d40;
  type local_d08;
  Type local_cf0;
  undefined1 local_cb8 [8];
  Matrix<double,_6,_1,_0,_6,_1> L3;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_c80;
  Matrix<double,3,1,0,3,1> local_c68 [8];
  Matrix<double,_3,_1,_0,_3,_1> D3;
  RealScalar local_c18;
  Type local_c10;
  type local_bd8;
  Type local_bc0;
  undefined1 local_b88 [8];
  Matrix<double,_6,_1,_0,_6,_1> L2;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_b50;
  Matrix<double,3,1,0,3,1> local_b38 [8];
  Matrix<double,_3,_1,_0,_3,_1> D2;
  RealScalar local_ae8;
  Type local_ae0;
  type local_aa8;
  Type local_a90;
  undefined1 local_a58 [8];
  Matrix<double,_6,_1,_0,_6,_1> L1;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_a20;
  Matrix<double,3,1,0,3,1> local_a08 [8];
  Matrix<double,_3,_1,_0,_3,_1> D1;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_9b8;
  Type local_960;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_928;
  Type local_8d0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_898;
  Type local_840;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_808;
  Type local_7b0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_778;
  Type local_720;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_6e8;
  Type local_690;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_658;
  Type local_600;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_5c8;
  Type local_570;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_538;
  Type local_4e0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_4a8;
  Type local_450;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_418;
  Type local_3c0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_388;
  undefined1 local_330 [8];
  Matrix<double,_3,_1,_0,_3,_1> tQ32;
  Matrix<double,_3,_1,_0,_3,_1> tQ31;
  Matrix<double,_3,_1,_0,_3,_1> tQ22;
  Matrix<double,_3,_1,_0,_3,_1> tQ21;
  Matrix<double,_3,_1,_0,_3,_1> tQ12;
  Matrix<double,_3,_1,_0,_3,_1> tQ11;
  Matrix<double,_3,_1,_0,_3,_1> tP32;
  Matrix<double,_3,_1,_0,_3,_1> tP31;
  Matrix<double,_3,_1,_0,_3,_1> tP22;
  Matrix<double,_3,_1,_0,_3,_1> tP21;
  Matrix<double,_3,_1,_0,_3,_1> tP12;
  undefined1 local_218 [8];
  Matrix<double,_3,_1,_0,_3,_1> tP11;
  undefined1 local_1f8 [8];
  Matrix<double,_4,_1,_0,_4,_1> R32_B;
  Matrix<double,_4,_1,_0,_4,_1> R31_B;
  Matrix<double,_4,_1,_0,_4,_1> Q32;
  Matrix<double,_4,_1,_0,_4,_1> Q31;
  Matrix<double,_4,_1,_0,_4,_1> R22_B;
  Matrix<double,_4,_1,_0,_4,_1> R21_B;
  Matrix<double,_4,_1,_0,_4,_1> Q22;
  Matrix<double,_4,_1,_0,_4,_1> Q21;
  Matrix<double,_4,_1,_0,_4,_1> R12_B;
  Matrix<double,_4,_1,_0,_4,_1> R11_B;
  Matrix<double,_4,_1,_0,_4,_1> Q12;
  Matrix<double,_4,_1,_0,_4,_1> Q11;
  Matrix<double,_4,_1,_0,_4,_1> P1_B;
  Matrix<double,_4,_1,_0,_4,_1> P1;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  *lCPair_local;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  *lPair_local;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *plPair_local;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *ptPair_local;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *out;
  
  sVar1 = std::
          vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
          ::size(ptPair);
  if ((sVar1 != 0) &&
     (sVar1 = std::
              vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
              ::size(lPair), 2 < sVar1)) {
    this = P1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
           + 3;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this);
    this_00 = Q11.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_00);
    this_01 = Q12.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_01);
    this_02 = R11_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_02);
    this_03 = R12_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_03);
    this_04 = Q21.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_04);
    this_05 = Q22.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_05);
    this_06 = R21_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_06);
    this_07 = R22_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_07);
    this_08 = Q31.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_08);
    this_09 = Q32.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_09);
    this_10 = R31_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_10);
    this_11 = R32_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_11);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)local_1f8);
    pvVar2 = std::
             vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
             ::operator[](ptPair,0);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this,&pvVar2->first);
    pvVar2 = std::
             vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
             ::operator[](ptPair,0);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_00,&pvVar2->second);
    pvVar3 = std::
             vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             ::operator[](lPair,0);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_01,(Matrix<double,_4,_1,_0,_4,_1> *)pvVar3);
    pvVar3 = std::
             vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             ::operator[](lPair,0);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_02,&(pvVar3->first).second);
    pvVar3 = std::
             vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             ::operator[](lPair,0);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_03,&(pvVar3->second).first);
    pvVar3 = std::
             vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             ::operator[](lPair,0);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_04,&(pvVar3->second).second);
    pvVar3 = std::
             vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             ::operator[](lPair,1);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_05,(Matrix<double,_4,_1,_0,_4,_1> *)pvVar3);
    pvVar3 = std::
             vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             ::operator[](lPair,1);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_06,&(pvVar3->first).second);
    pvVar3 = std::
             vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             ::operator[](lPair,1);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_07,&(pvVar3->second).first);
    pvVar3 = std::
             vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             ::operator[](lPair,1);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_08,&(pvVar3->second).second);
    pvVar3 = std::
             vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             ::operator[](lPair,2);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_09,(Matrix<double,_4,_1,_0,_4,_1> *)pvVar3);
    pvVar3 = std::
             vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             ::operator[](lPair,2);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_10,&(pvVar3->first).second);
    pvVar3 = std::
             vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             ::operator[](lPair,2);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_11,&(pvVar3->second).first);
    pvVar3 = std::
             vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             ::operator[](lPair,2);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)local_1f8,&(pvVar3->second).second);
    tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
    _7_1_ = 0;
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::vector(__return_storage_ptr__);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_218);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_330);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              (&local_3c0,
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
               (Q12.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3),3);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        (Q12.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 3),3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_388,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_3c0,
               pSVar4);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)local_218,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                *)&local_388);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              (&local_450,
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
               (R11_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3),3);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        (R11_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array + 3),3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_418,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_450,
               pSVar4);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                *)&local_418);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              (&local_4e0,
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
               (R12_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3),3);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        (R12_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array + 3),3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_4a8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_4e0,
               pSVar4);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                *)&local_4a8);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              (&local_570,
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
               (Q21.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3),3);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        (Q21.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 3),3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_538,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_570,
               pSVar4);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                *)&local_538);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              (&local_600,
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
               (Q22.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3),3);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        (Q22.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 3),3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_5c8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_600,
               pSVar4);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                *)&local_5c8);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              (&local_690,
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
               (R21_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3),3);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        (R21_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array + 3),3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_658,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_690,
               pSVar4);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                *)&local_658);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              (&local_720,
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
               (R22_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3),3);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        (R22_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array + 3),3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_6e8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_720,
               pSVar4);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                *)&local_6e8);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              (&local_7b0,
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
               (Q31.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3),3);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        (Q31.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 3),3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_778,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_7b0,
               pSVar4);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                *)&local_778);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              (&local_840,
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
               (Q32.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3),3);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        (Q32.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 3),3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_808,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_840,
               pSVar4);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                *)&local_808);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              (&local_8d0,
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
               (R31_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3),3);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        (R31_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array + 3),3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_898,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_8d0,
               pSVar4);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                *)&local_898);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              (&local_960,
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
               (R32_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3),3);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        (R32_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array + 3),3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_928,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_960,
               pSVar4);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                *)&local_928);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)(D1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 2),
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_1f8,3);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)local_1f8,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_9b8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)
               (D1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),pSVar4);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)local_330,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                *)&local_9b8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (&local_a20,
               (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_218);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (local_a08,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_a20);
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_a58);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              (&local_a90,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a58,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_a90,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a08);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_aa8,
               (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_218);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              (&local_ae0,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a58,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_ae0,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_aa8);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)(D2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 2),
               (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a58,3);
    local_ae8 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)(D2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                           .m_data.array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a58,&local_ae8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (&local_b50,
               (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (local_b38,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_b50);
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_b88);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              (&local_bc0,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_b88,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_bc0,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_b38);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_bd8,
               (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              (&local_c10,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_b88,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_c10,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_bd8);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)(D3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 2),
               (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_b88,3);
    local_c18 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)(D3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                           .m_data.array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_b88,&local_c18);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (&local_c80,
               (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (local_c68,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_c80);
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_cb8);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              (&local_cf0,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_cb8,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_cf0,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_c68);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_d08,
               (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              (&local_d40,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_cb8,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_d40,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_d08);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              (&local_d80,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_cb8,3);
    local_d48 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)&local_d80);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_cb8,&local_d48);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)(M1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 5),
               (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (local_a08,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)(M1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 5));
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_dc8);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              (&local_e00,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_dc8,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_e00,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a08);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_e18,
               (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              (&local_e50,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_dc8,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_e50,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_e18);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              (&local_e90,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_dc8,3);
    local_e58 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)&local_e90);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_dc8,&local_e58);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)(M2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 5),
               (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (local_b38,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)(M2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 5));
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_ed8);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              (&local_f10,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_ed8,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_f10,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_b38);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_f28,
               (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              (&local_f60,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_ed8,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_f60,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_f28);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              (&local_fa0,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_ed8,3);
    local_f68 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)&local_fa0);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_ed8,&local_f68);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)(M3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 5),(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_330,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (local_c68,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)(M3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 5));
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_fe8);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              (&local_1020,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_fe8,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_1020,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_c68);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_1038,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_330,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              (&local_1070,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_fe8,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_1070,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_1038);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&predTrans.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_fe8,3);
    local_1078 = Eigen::
                 MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                           ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                             *)&predTrans.
                                super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_fe8,&local_1078);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
              (&local_10e8,
               (Matrix<double,_4,_1,_0,_4,_1> *)
               (P1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3));
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
              ((Matrix<double,_4,_1,_0,_4,_1> *)
               (TV.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),
               (Matrix<double,_4,_1,_0,_4,_1> *)
               (Q11.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3));
    getPredefinedTransformations3L1Q<double>
              ((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)local_10c8,&local_10e8,
               (Matrix<double,_4,_1,_0,_4,_1> *)
               (TV.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf));
    pvVar5 = std::
             vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             ::back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *)local_10c8);
    Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
              ((Matrix<double,_4,_4,_0,_4,_4> *)
               (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),pvVar5);
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::pop_back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)local_10c8);
    pvVar5 = std::
             vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             ::back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *)local_10c8);
    Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
              ((Matrix<double,_4,_4,_0,_4,_4> *)
               (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array + 0x23),pvVar5);
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::pop_back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)local_10c8);
    Eigen::Matrix<double,_6,_6,_0,_6,_6>::Matrix
              ((Matrix<double,_6,_6,_0,_6,_6> *)
               (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array + 0x23));
    Eigen::Matrix<double,_6,_6,_0,_6,_6>::Matrix((Matrix<double,_6,_6,_0,_6,_6> *)local_1448);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
               (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array + 0x23));
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)local_1448);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_1480,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array + 0x23),3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
              (&local_14b8,
               (DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)
               (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array + 0x23),3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_14b8,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_1480);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_14f0,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array + 0x23),3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomRightCorner<int,int>
              (&local_1528,
               (DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)
               (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array + 0x23),3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_1528,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_14f0);
    local_15b4 = -1;
    Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::col
              (&local_16a8,
               (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
               (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array + 0x23),3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              (&local_1678,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
               &local_16a8,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((Matrix<double,3,1,0,3,1> *)&local_1618,
               (EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&local_1678);
    getSkew<double>(&local_1600,&local_1618);
    Eigen::operator*(&local_15b0,&local_15b4,(StorageBaseType *)&local_1600);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_16e0,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array + 0x23),3,3);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*(&local_1588,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
                 *)&local_15b0,
                (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                &local_16e0);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomLeftCorner<int,int>
              (&local_1718,
               (DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)
               (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array + 0x23),3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_1718,
               (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                *)&local_1588);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_1750,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
              (&local_1788,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1448,3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_1788,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_1750);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_17c0,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomRightCorner<int,int>
              (&local_17f8,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1448,3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_17f8,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_17c0);
    local_1884 = -1;
    Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::col
              (&local_1978,
               (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
               (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              (&local_1948,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
               &local_1978,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((Matrix<double,3,1,0,3,1> *)&local_18e8,
               (EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&local_1948);
    getSkew<double>(&local_18d0,&local_18e8);
    Eigen::operator*(&local_1880,&local_1884,(StorageBaseType *)&local_18d0);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_19b0,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),3,3);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*(&local_1858,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
                 *)&local_1880,
                (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                &local_19b0);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomLeftCorner<int,int>
              ((Type *)(L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array + 5),(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1448,3
               ,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)
               (L1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array + 5),
               (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                *)&local_1858);
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
              ((Matrix<double,_6,_1,_0,_6,_1> *)
               (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array + 5));
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
              ((Matrix<double,_6,_1,_0,_6,_1> *)
               (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array + 5));
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
              ((Matrix<double,_6,_1,_0,_6,_1> *)
               (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array + 5));
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
              ((Matrix<double,_6,_1,_0,_6,_1> *)
               (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array + 5));
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
              ((Matrix<double,_6,_1,_0,_6,_1> *)
               (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array + 5));
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_1b08);
    local_1b18 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                            (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                             .m_storage.m_data.array + 0x23),
                            (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a58);
    Eigen::Matrix<double,6,1,0,6,1>::operator=
              ((Matrix<double,6,1,0,6,1> *)
               (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array + 5),
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)&local_1b18);
    local_1b28 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                            (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                             .m_storage.m_data.array + 0x23),
                            (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_b88);
    Eigen::Matrix<double,6,1,0,6,1>::operator=
              ((Matrix<double,6,1,0,6,1> *)
               (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array + 5),
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)&local_1b28);
    local_1b38 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                            (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                             .m_storage.m_data.array + 0x23),
                            (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_cb8);
    Eigen::Matrix<double,6,1,0,6,1>::operator=
              ((Matrix<double,6,1,0,6,1> *)
               (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array + 5),
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)&local_1b38);
    local_1b48 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1448,
                            (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_dc8);
    Eigen::Matrix<double,6,1,0,6,1>::operator=
              ((Matrix<double,6,1,0,6,1> *)
               (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array + 5),
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)&local_1b48);
    local_1b58 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1448,
                            (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_ed8);
    Eigen::Matrix<double,6,1,0,6,1>::operator=
              ((Matrix<double,6,1,0,6,1> *)
               (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array + 5),
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)&local_1b58);
    PVar62 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1448,
                        (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_fe8);
    local_1b60 = PVar62.m_rhs;
    l11 = (double)PVar62.m_lhs;
    Eigen::Matrix<double,6,1,0,6,1>::operator=
              ((Matrix<double,6,1,0,6,1> *)local_1b08,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)&l11);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),0);
    dVar20 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),1);
    dVar21 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),2);
    dVar22 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),3);
    dVar23 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),4);
    dVar24 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (L2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),5);
    dVar25 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),0);
    dVar30 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),1);
    dVar31 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),2);
    dVar32 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),3);
    dVar33 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),4);
    dVar34 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (L3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),5);
    dVar35 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),0);
    dVar40 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),1);
    dVar41 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),2);
    dVar42 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),3);
    dVar43 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),4);
    dVar44 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M1_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),5);
    dVar45 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),0);
    dVar26 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),1);
    dVar27 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),2);
    dVar28 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),3);
    dVar29 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),4);
    dVar36 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M2_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),5);
    dVar37 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),0);
    dVar38 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),1);
    dVar39 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),2);
    dVar46 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),3);
    dVar47 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),4);
    dVar48 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        (M3_1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                         .m_data.array + 5),5);
    dVar49 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1b08,0);
    dVar50 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1b08,1);
    dVar51 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1b08,2);
    dVar52 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1b08,3);
    dVar53 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1b08,4);
    dVar54 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1b08,5);
    dVar55 = *pSVar6;
    dVar11 = dVar25 * dVar28 +
             dVar24 * dVar27 + dVar23 * dVar26 + dVar22 * dVar37 + dVar20 * dVar29 + dVar21 * dVar36
    ;
    dVar12 = ((dVar23 + dVar23) * dVar27 + ((dVar20 + dVar20) * dVar36 - (dVar21 + dVar21) * dVar29)
             ) - (dVar24 + dVar24) * dVar26;
    dVar13 = dVar25 * dVar28 +
             (((dVar22 * dVar37 + (-dVar20 * dVar29 - dVar21 * dVar36)) - dVar23 * dVar26) -
             dVar24 * dVar27);
    dVar14 = (dVar25 + dVar25) * dVar26 +
             ((dVar20 * -2.0 * dVar37 + (dVar22 + dVar22) * dVar29) - (dVar23 + dVar23) * dVar28);
    dVar15 = (dVar25 + dVar25) * dVar27 +
             (dVar24 + dVar24) * dVar28 + (dVar21 + dVar21) * dVar37 + (dVar22 + dVar22) * dVar36;
    dVar16 = (dVar24 * dVar27 +
             (((dVar21 * dVar36 - dVar20 * dVar29) - dVar22 * dVar37) - dVar23 * dVar26)) -
             dVar25 * dVar28;
    dVar17 = ((dVar24 + dVar24) * dVar28 + ((dVar21 + dVar21) * dVar37 - (dVar22 + dVar22) * dVar36)
             ) - (dVar25 + dVar25) * dVar27;
    dVar18 = (dVar25 + dVar25) * dVar26 +
             (dVar23 + dVar23) * dVar28 + (dVar20 + dVar20) * dVar37 + (dVar22 + dVar22) * dVar29;
    dVar19 = (dVar24 + dVar24) * dVar26 +
             (dVar23 + dVar23) * dVar27 + (dVar20 + dVar20) * dVar36 + (dVar21 + dVar21) * dVar29;
    dVar20 = ((dVar23 * dVar26 + ((dVar20 * dVar29 - dVar21 * dVar36) - dVar22 * dVar37)) -
             dVar24 * dVar27) - dVar25 * dVar28;
    dVar21 = dVar35 * dVar46 +
             dVar34 * dVar39 + dVar33 * dVar38 + dVar32 * dVar49 + dVar30 * dVar47 + dVar31 * dVar48
    ;
    dVar22 = ((dVar33 + dVar33) * dVar39 + ((dVar30 + dVar30) * dVar48 - (dVar31 + dVar31) * dVar47)
             ) - (dVar34 + dVar34) * dVar38;
    dVar23 = dVar35 * dVar46 +
             (((dVar32 * dVar49 + (-dVar30 * dVar47 - dVar31 * dVar48)) - dVar33 * dVar38) -
             dVar34 * dVar39);
    dVar24 = (dVar35 + dVar35) * dVar38 +
             ((dVar30 * -2.0 * dVar49 + (dVar32 + dVar32) * dVar47) - (dVar33 + dVar33) * dVar46);
    dVar25 = (dVar35 + dVar35) * dVar39 +
             (dVar34 + dVar34) * dVar46 + (dVar31 + dVar31) * dVar49 + (dVar32 + dVar32) * dVar48;
    dVar26 = (dVar34 * dVar39 +
             (((dVar31 * dVar48 - dVar30 * dVar47) - dVar32 * dVar49) - dVar33 * dVar38)) -
             dVar35 * dVar46;
    dVar27 = ((dVar34 + dVar34) * dVar46 + ((dVar31 + dVar31) * dVar49 - (dVar32 + dVar32) * dVar48)
             ) - (dVar35 + dVar35) * dVar39;
    dVar28 = (dVar35 + dVar35) * dVar38 +
             (dVar33 + dVar33) * dVar46 + (dVar30 + dVar30) * dVar49 + (dVar32 + dVar32) * dVar47;
    dVar29 = (dVar34 + dVar34) * dVar38 +
             (dVar33 + dVar33) * dVar39 + (dVar30 + dVar30) * dVar48 + (dVar31 + dVar31) * dVar47;
    dVar30 = ((dVar33 * dVar38 + ((dVar30 * dVar47 - dVar31 * dVar48) - dVar32 * dVar49)) -
             dVar34 * dVar39) - dVar35 * dVar46;
    dVar31 = dVar45 * dVar52 +
             dVar44 * dVar51 + dVar43 * dVar50 + dVar42 * dVar55 + dVar40 * dVar53 + dVar41 * dVar54
    ;
    dVar32 = ((dVar43 + dVar43) * dVar51 + ((dVar40 + dVar40) * dVar54 - (dVar41 + dVar41) * dVar53)
             ) - (dVar44 + dVar44) * dVar50;
    dVar33 = dVar45 * dVar52 +
             (((dVar42 * dVar55 + (-dVar40 * dVar53 - dVar41 * dVar54)) - dVar43 * dVar50) -
             dVar44 * dVar51);
    dVar34 = (dVar45 + dVar45) * dVar50 +
             ((dVar40 * -2.0 * dVar55 + (dVar42 + dVar42) * dVar53) - (dVar43 + dVar43) * dVar52);
    dVar35 = (dVar45 + dVar45) * dVar51 +
             (dVar44 + dVar44) * dVar52 + (dVar41 + dVar41) * dVar55 + (dVar42 + dVar42) * dVar54;
    dVar36 = (dVar44 * dVar51 +
             (((dVar41 * dVar54 - dVar40 * dVar53) - dVar42 * dVar55) - dVar43 * dVar50)) -
             dVar45 * dVar52;
    dVar37 = ((dVar44 + dVar44) * dVar52 + ((dVar41 + dVar41) * dVar55 - (dVar42 + dVar42) * dVar54)
             ) - (dVar45 + dVar45) * dVar51;
    dVar38 = (dVar45 + dVar45) * dVar50 +
             (dVar43 + dVar43) * dVar52 + (dVar40 + dVar40) * dVar55 + (dVar42 + dVar42) * dVar53;
    dVar39 = (dVar44 + dVar44) * dVar50 +
             (dVar43 + dVar43) * dVar51 + (dVar40 + dVar40) * dVar54 + (dVar41 + dVar41) * dVar53;
    dVar40 = ((dVar43 * dVar50 + ((dVar40 * dVar53 - dVar41 * dVar54) - dVar42 * dVar55)) -
             dVar44 * dVar51) - dVar45 * dVar52;
    dVar41 = ((dVar15 * dVar23 * dVar34 +
              dVar14 * dVar25 * dVar33 +
              ((dVar13 * dVar24 * dVar35 - dVar13 * dVar25 * dVar34) - dVar14 * dVar23 * dVar35)) -
             dVar15 * dVar24 * dVar33) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar42 = (dVar19 * dVar25 * dVar33 +
             (((dVar15 * dVar23 * dVar39 + (dVar13 * dVar29 * dVar35 - dVar13 * dVar25 * dVar39)) -
              dVar15 * dVar29 * dVar33) - dVar19 * dVar23 * dVar35)) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar43 = (dVar15 * dVar23 * dVar32 +
             (((dVar13 * dVar22 * dVar35 + (dVar12 * dVar25 * dVar33 - dVar12 * dVar23 * dVar35)) -
              dVar13 * dVar25 * dVar32) - dVar15 * dVar22 * dVar33)) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar44 = (dVar18 * dVar25 * dVar33 +
             (((dVar15 * dVar23 * dVar38 + (dVar13 * dVar28 * dVar35 - dVar13 * dVar25 * dVar38)) -
              dVar15 * dVar28 * dVar33) - dVar18 * dVar23 * dVar35)) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar45 = (dVar15 * dVar23 * dVar31 +
             (((dVar13 * dVar21 * dVar35 + (dVar11 * dVar25 * dVar33 - dVar11 * dVar23 * dVar35)) -
              dVar13 * dVar25 * dVar31) - dVar15 * dVar21 * dVar33)) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar46 = (dVar17 * dVar25 * dVar33 +
             (((dVar15 * dVar23 * dVar37 + (dVar13 * dVar27 * dVar35 - dVar13 * dVar25 * dVar37)) -
              dVar15 * dVar27 * dVar33) - dVar17 * dVar23 * dVar35)) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar47 = (dVar20 * dVar25 * dVar33 +
             (((dVar15 * dVar23 * dVar40 + (dVar13 * dVar30 * dVar35 - dVar13 * dVar25 * dVar40)) -
              dVar15 * dVar30 * dVar33) - dVar20 * dVar23 * dVar35)) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar48 = (dVar16 * dVar25 * dVar34 +
             (((dVar15 * dVar24 * dVar36 + (dVar14 * dVar26 * dVar35 - dVar14 * dVar25 * dVar36)) -
              dVar15 * dVar26 * dVar34) - dVar16 * dVar24 * dVar35)) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar49 = (dVar19 * dVar26 * dVar35 +
             (((dVar16 * dVar25 * dVar39 + (dVar15 * dVar29 * dVar36 - dVar15 * dVar26 * dVar39)) -
              dVar16 * dVar29 * dVar35) - dVar19 * dVar25 * dVar36)) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar50 = (dVar16 * dVar25 * dVar32 +
             (((dVar15 * dVar22 * dVar36 + (dVar12 * dVar26 * dVar35 - dVar12 * dVar25 * dVar36)) -
              dVar15 * dVar26 * dVar32) - dVar16 * dVar22 * dVar35)) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar51 = (dVar18 * dVar26 * dVar35 +
             (((dVar16 * dVar25 * dVar38 + (dVar15 * dVar28 * dVar36 - dVar15 * dVar26 * dVar38)) -
              dVar16 * dVar28 * dVar35) - dVar18 * dVar25 * dVar36)) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar52 = (dVar16 * dVar25 * dVar31 +
             (((dVar15 * dVar21 * dVar36 + (dVar11 * dVar26 * dVar35 - dVar11 * dVar25 * dVar36)) -
              dVar15 * dVar26 * dVar31) - dVar16 * dVar21 * dVar35)) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar53 = (dVar17 * dVar26 * dVar35 +
             (((dVar16 * dVar25 * dVar37 + (dVar15 * dVar27 * dVar36 - dVar15 * dVar26 * dVar37)) -
              dVar16 * dVar27 * dVar35) - dVar17 * dVar25 * dVar36)) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar54 = (dVar20 * dVar26 * dVar35 +
             (((dVar16 * dVar25 * dVar40 + (dVar15 * dVar30 * dVar36 - dVar15 * dVar26 * dVar40)) -
              dVar16 * dVar30 * dVar35) - dVar20 * dVar25 * dVar36)) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar24 = (dVar16 * dVar24 * dVar33 +
             (((dVar14 * dVar23 * dVar36 + (dVar13 * dVar26 * dVar34 - dVar13 * dVar24 * dVar36)) -
              dVar14 * dVar26 * dVar33) - dVar16 * dVar23 * dVar34)) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar34 = ((dVar19 * dVar23 * dVar36 +
              dVar16 * dVar29 * dVar33 +
              ((dVar13 * dVar26 * dVar39 - dVar13 * dVar29 * dVar36) - dVar16 * dVar23 * dVar39)) -
             dVar19 * dVar26 * dVar33) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar22 = ((dVar16 * dVar22 * dVar33 +
              dVar13 * dVar26 * dVar32 +
              ((dVar12 * dVar23 * dVar36 - dVar12 * dVar26 * dVar33) - dVar13 * dVar22 * dVar36)) -
             dVar16 * dVar23 * dVar32) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar32 = ((dVar18 * dVar23 * dVar36 +
              dVar16 * dVar28 * dVar33 +
              ((dVar13 * dVar26 * dVar38 - dVar13 * dVar28 * dVar36) - dVar16 * dVar23 * dVar38)) -
             dVar18 * dVar26 * dVar33) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar21 = ((dVar16 * dVar21 * dVar33 +
              dVar13 * dVar26 * dVar31 +
              ((dVar11 * dVar23 * dVar36 - dVar11 * dVar26 * dVar33) - dVar13 * dVar21 * dVar36)) -
             dVar16 * dVar23 * dVar31) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar31 = ((dVar17 * dVar23 * dVar36 +
              dVar16 * dVar27 * dVar33 +
              ((dVar13 * dVar26 * dVar37 - dVar13 * dVar27 * dVar36) - dVar16 * dVar23 * dVar37)) -
             dVar17 * dVar26 * dVar33) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar20 = ((dVar20 * dVar23 * dVar36 +
              dVar16 * dVar30 * dVar33 +
              ((dVar13 * dVar26 * dVar40 - dVar13 * dVar30 * dVar36) - dVar16 * dVar23 * dVar40)) -
             dVar20 * dVar26 * dVar33) /
             ((dVar16 * dVar23 * dVar35 +
              dVar15 * dVar26 * dVar33 +
              ((dVar13 * dVar25 * dVar36 - dVar13 * dVar26 * dVar35) - dVar15 * dVar23 * dVar36)) -
             dVar16 * dVar25 * dVar33);
    dVar23 = (dVar43 * dVar48 - dVar24 * dVar22) - dVar21;
    dVar25 = (((dVar43 * dVar49 + dVar44 * dVar48) - dVar24 * dVar32) - dVar34 * dVar22) - dVar31;
    dVar30 = (dVar44 * dVar49 - dVar34 * dVar32) - dVar20;
    dVar33 = (((dVar41 * dVar22 + dVar43 * dVar50) - dVar43 * dVar24) + dVar45) - dVar22 * dVar22;
    dVar35 = (((dVar44 * dVar50 +
               ((dVar43 * dVar51 + dVar41 * dVar32 + dVar42 * dVar22) - dVar43 * dVar34)) -
              dVar44 * dVar24) + dVar46) - (dVar22 + dVar22) * dVar32;
    dVar40 = (((dVar42 * dVar32 + dVar44 * dVar51) - dVar44 * dVar34) + dVar47) - dVar32 * dVar32;
    dVar26 = ((dVar41 * dVar21 + dVar43 * dVar52) - dVar45 * dVar24) - dVar22 * dVar21;
    dVar27 = ((((dVar44 * dVar52 + dVar43 * dVar53 + dVar41 * dVar31 + dVar42 * dVar21) -
               dVar45 * dVar34) - dVar46 * dVar24) - dVar22 * dVar31) - dVar32 * dVar21;
    dVar28 = ((((dVar44 * dVar53 + dVar43 * dVar54 + dVar41 * dVar20 + dVar42 * dVar31) -
               dVar46 * dVar34) - dVar47 * dVar24) - dVar22 * dVar20) - dVar32 * dVar31;
    dVar29 = ((dVar42 * dVar20 + dVar44 * dVar54) - dVar47 * dVar34) - dVar32 * dVar20;
    dVar36 = dVar24 * dVar24 + (((dVar48 * dVar22 - dVar41 * dVar48) - dVar50 * dVar24) - dVar52);
    dVar37 = (dVar24 + dVar24) * dVar34 +
             ((((dVar49 * dVar22 + dVar48 * dVar32 + (-dVar41 * dVar49 - dVar42 * dVar48)) -
               dVar50 * dVar34) - dVar51 * dVar24) - dVar53);
    dVar38 = dVar34 * dVar34 + (((dVar49 * dVar32 - dVar42 * dVar49) - dVar51 * dVar34) - dVar54);
    dVar39 = (dVar24 * dVar22 - dVar43 * dVar48) + dVar21;
    dVar55 = dVar34 * dVar22 + dVar24 * dVar32 + (-dVar43 * dVar49 - dVar44 * dVar48) + dVar31;
    dVar11 = (dVar34 * dVar32 - dVar44 * dVar49) + dVar20;
    dVar12 = dVar24 * dVar21 + dVar52 * dVar22 + (-dVar45 * dVar48 - dVar50 * dVar21);
    dVar13 = dVar34 * dVar21 +
             dVar24 * dVar31 +
             dVar53 * dVar22 +
             dVar52 * dVar32 +
             (((-dVar45 * dVar49 - dVar46 * dVar48) - dVar50 * dVar31) - dVar51 * dVar21);
    dVar14 = dVar34 * dVar31 +
             dVar24 * dVar20 +
             dVar54 * dVar22 +
             dVar53 * dVar32 +
             (((-dVar46 * dVar49 - dVar47 * dVar48) - dVar50 * dVar20) - dVar51 * dVar31);
    dVar15 = dVar34 * dVar20 + dVar54 * dVar32 + (-dVar47 * dVar49 - dVar51 * dVar20);
    dVar16 = (dVar24 + dVar24) * dVar21 +
             (dVar24 + dVar24) * dVar24 * dVar22 +
             dVar48 * dVar22 * dVar22 +
             ((((dVar41 * dVar24 * dVar24 +
                ((-dVar41 * dVar41 * dVar48 - dVar41 * dVar50 * dVar24) - dVar41 * dVar52)) -
               dVar43 * dVar48 * dVar50) - dVar43 * dVar48 * dVar24) - dVar45 * dVar48);
    dVar17 = (dVar34 + dVar34) * dVar21 +
             (dVar24 + dVar24) * dVar31 +
             dVar24 * 4.0 * dVar34 * dVar22 +
             (dVar24 + dVar24) * dVar24 * dVar32 +
             dVar49 * dVar22 * dVar22 +
             (dVar48 + dVar48) * dVar22 * dVar32 +
             (((((((((dVar42 * dVar24 * dVar24 +
                     ((((dVar41 + dVar41) * dVar24 * dVar34 +
                       ((((-dVar41 * dVar41 * dVar49 - (dVar41 + dVar41) * dVar42 * dVar48) -
                         dVar41 * dVar50 * dVar34) - dVar41 * dVar51 * dVar24) - dVar41 * dVar53)) -
                      dVar42 * dVar50 * dVar24) - dVar42 * dVar52)) - dVar43 * dVar48 * dVar51) -
                   dVar43 * dVar48 * dVar34) - dVar43 * dVar49 * dVar50) - dVar43 * dVar49 * dVar24)
                - dVar44 * dVar48 * dVar50) - dVar44 * dVar48 * dVar24) - dVar45 * dVar49) -
             dVar46 * dVar48);
    dVar18 = (dVar34 + dVar34) * dVar31 +
             (dVar34 + dVar34) * dVar34 * dVar22 +
             (dVar24 + dVar24) * dVar20 +
             dVar24 * 4.0 * dVar34 * dVar32 +
             (dVar49 + dVar49) * dVar22 * dVar32 +
             dVar48 * dVar32 * dVar32 +
             ((((((((((dVar42 + dVar42) * dVar24 * dVar34 +
                     (((((dVar41 * dVar34 * dVar34 +
                         ((dVar41 * -2.0 * dVar42 * dVar49 - dVar41 * dVar51 * dVar34) -
                         dVar41 * dVar54)) - dVar42 * dVar42 * dVar48) - dVar42 * dVar50 * dVar34) -
                      dVar42 * dVar51 * dVar24) - dVar42 * dVar53)) - dVar43 * dVar49 * dVar51) -
                   dVar43 * dVar49 * dVar34) - dVar44 * dVar48 * dVar51) - dVar44 * dVar48 * dVar34)
                - dVar44 * dVar49 * dVar50) - dVar44 * dVar49 * dVar24) - dVar46 * dVar49) -
             dVar47 * dVar48);
    dVar19 = (dVar34 + dVar34) * dVar20 +
             (dVar34 + dVar34) * dVar34 * dVar32 +
             dVar49 * dVar32 * dVar32 +
             ((((dVar42 * dVar34 * dVar34 +
                ((-dVar42 * dVar42 * dVar49 - dVar42 * dVar51 * dVar34) - dVar42 * dVar54)) -
               dVar44 * dVar49 * dVar51) - dVar44 * dVar49 * dVar34) - dVar47 * dVar49);
    dVar56 = (dVar22 + dVar22) * dVar21 +
             (dVar24 + dVar24) * dVar22 * dVar22 +
             dVar50 * dVar22 * dVar22 +
             ((dVar43 * dVar24 * dVar24 +
              ((((-dVar41 * dVar43 * dVar48 - dVar41 * dVar50 * dVar22) - dVar43 * dVar48 * dVar22)
               - dVar43 * dVar50 * dVar50) - dVar43 * dVar52)) - dVar45 * dVar50);
    dVar57 = (dVar32 + dVar32) * dVar21 +
             (dVar22 + dVar22) * dVar31 +
             (dVar34 + dVar34) * dVar22 * dVar22 +
             dVar24 * 4.0 * dVar22 * dVar32 +
             dVar51 * dVar22 * dVar22 +
             (dVar50 + dVar50) * dVar22 * dVar32 +
             (((dVar44 * dVar24 * dVar24 +
               (((((dVar43 + dVar43) * dVar24 * dVar34 +
                  (((((((((-dVar41 * dVar43 * dVar49 - dVar41 * dVar44 * dVar48) -
                         dVar41 * dVar50 * dVar32) - dVar41 * dVar51 * dVar22) -
                       dVar42 * dVar43 * dVar48) - dVar42 * dVar50 * dVar22) -
                     dVar43 * dVar48 * dVar32) - dVar43 * dVar49 * dVar22) -
                   (dVar43 + dVar43) * dVar50 * dVar51) - dVar43 * dVar53)) -
                 dVar44 * dVar48 * dVar22) - dVar44 * dVar50 * dVar50) - dVar44 * dVar52)) -
              dVar45 * dVar51) - dVar46 * dVar50);
    dVar58 = (dVar32 + dVar32) * dVar31 +
             (dVar22 + dVar22) * dVar20 +
             dVar34 * 4.0 * dVar22 * dVar32 +
             (dVar24 + dVar24) * dVar32 * dVar32 +
             (dVar51 + dVar51) * dVar22 * dVar32 +
             dVar50 * dVar32 * dVar32 +
             ((((dVar44 + dVar44) * dVar24 * dVar34 +
               (((((dVar43 * dVar34 * dVar34 +
                   ((((((((-dVar41 * dVar44 * dVar49 - dVar41 * dVar51 * dVar32) -
                         dVar42 * dVar43 * dVar49) - dVar42 * dVar44 * dVar48) -
                       dVar42 * dVar50 * dVar32) - dVar42 * dVar51 * dVar22) -
                     dVar43 * dVar49 * dVar32) - dVar43 * dVar51 * dVar51) - dVar43 * dVar54)) -
                  dVar44 * dVar48 * dVar32) - dVar44 * dVar49 * dVar22) -
                (dVar44 + dVar44) * dVar50 * dVar51) - dVar44 * dVar53)) - dVar46 * dVar51) -
             dVar47 * dVar50);
    dVar59 = (dVar32 + dVar32) * dVar20 +
             (dVar34 + dVar34) * dVar32 * dVar32 +
             dVar51 * dVar32 * dVar32 +
             ((dVar44 * dVar34 * dVar34 +
              ((((-dVar42 * dVar44 * dVar49 - dVar42 * dVar51 * dVar32) - dVar44 * dVar49 * dVar32)
               - dVar44 * dVar51 * dVar51) - dVar44 * dVar54)) - dVar47 * dVar51);
    dVar60 = dVar21 * dVar21 +
             (dVar24 + dVar24) * dVar22 * dVar21 +
             dVar52 * dVar22 * dVar22 +
             dVar45 * dVar24 * dVar24 +
             ((((-dVar41 * dVar45 * dVar48 - dVar41 * dVar50 * dVar21) - dVar43 * dVar48 * dVar21) -
              dVar43 * dVar50 * dVar52) - dVar45 * dVar52);
    dVar61 = (dVar21 + dVar21) * dVar31 +
             (dVar34 + dVar34) * dVar22 * dVar21 +
             (dVar24 + dVar24) * dVar32 * dVar21 +
             (dVar24 + dVar24) * dVar22 * dVar31 +
             dVar53 * dVar22 * dVar22 +
             (dVar52 + dVar52) * dVar22 * dVar32 +
             dVar46 * dVar24 * dVar24 +
             (((dVar45 + dVar45) * dVar24 * dVar34 +
              ((((((((((((-dVar41 * dVar45 * dVar49 - dVar41 * dVar46 * dVar48) -
                        dVar41 * dVar50 * dVar31) - dVar41 * dVar51 * dVar21) -
                      dVar42 * dVar45 * dVar48) - dVar42 * dVar50 * dVar21) -
                    dVar43 * dVar48 * dVar31) - dVar43 * dVar49 * dVar21) - dVar43 * dVar50 * dVar53
                  ) - dVar43 * dVar51 * dVar52) - dVar44 * dVar48 * dVar21) -
               dVar44 * dVar50 * dVar52) - dVar45 * dVar53)) - dVar46 * dVar52);
    dVar45 = dVar31 * dVar31 +
             (dVar21 + dVar21) * dVar20 +
             (dVar34 + dVar34) * dVar32 * dVar21 +
             (dVar34 + dVar34) * dVar22 * dVar31 +
             (dVar24 + dVar24) * dVar32 * dVar31 +
             (dVar24 + dVar24) * dVar22 * dVar20 +
             dVar54 * dVar22 * dVar22 +
             (dVar53 + dVar53) * dVar22 * dVar32 +
             dVar52 * dVar32 * dVar32 +
             dVar47 * dVar24 * dVar24 +
             (((dVar46 + dVar46) * dVar24 * dVar34 +
              ((dVar45 * dVar34 * dVar34 +
               ((((((((((((((((-dVar41 * dVar46 * dVar49 - dVar41 * dVar47 * dVar48) -
                             dVar41 * dVar50 * dVar20) - dVar41 * dVar51 * dVar31) -
                           dVar42 * dVar45 * dVar49) - dVar42 * dVar46 * dVar48) -
                         dVar42 * dVar50 * dVar31) - dVar42 * dVar51 * dVar21) -
                       dVar43 * dVar48 * dVar20) - dVar43 * dVar49 * dVar31) -
                     dVar43 * dVar50 * dVar54) - dVar43 * dVar51 * dVar53) -
                   dVar44 * dVar48 * dVar31) - dVar44 * dVar49 * dVar21) - dVar44 * dVar50 * dVar53)
                - dVar44 * dVar51 * dVar52) - dVar45 * dVar54)) - dVar46 * dVar53)) -
             dVar47 * dVar52);
    dVar22 = (dVar31 + dVar31) * dVar20 +
             (dVar34 + dVar34) * dVar32 * dVar31 +
             (dVar34 + dVar34) * dVar22 * dVar20 +
             (dVar24 + dVar24) * dVar32 * dVar20 +
             (dVar54 + dVar54) * dVar22 * dVar32 +
             dVar53 * dVar32 * dVar32 +
             (dVar47 + dVar47) * dVar24 * dVar34 +
             ((dVar46 * dVar34 * dVar34 +
              ((((((((((((-dVar41 * dVar47 * dVar49 - dVar41 * dVar51 * dVar20) -
                        dVar42 * dVar46 * dVar49) - dVar42 * dVar47 * dVar48) -
                      dVar42 * dVar50 * dVar20) - dVar42 * dVar51 * dVar31) -
                    dVar43 * dVar49 * dVar20) - dVar43 * dVar51 * dVar54) - dVar44 * dVar48 * dVar20
                  ) - dVar44 * dVar49 * dVar31) - dVar44 * dVar50 * dVar54) -
               dVar44 * dVar51 * dVar53) - dVar46 * dVar54)) - dVar47 * dVar53);
    dVar21 = dVar20 * dVar20 +
             (dVar34 + dVar34) * dVar32 * dVar20 +
             dVar54 * dVar32 * dVar32 +
             dVar47 * dVar34 * dVar34 +
             ((((-dVar42 * dVar47 * dVar49 - dVar42 * dVar51 * dVar20) - dVar44 * dVar49 * dVar20) -
              dVar44 * dVar51 * dVar54) - dVar47 * dVar54);
    coeff.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8] =
         (dVar29 * dVar38 * dVar59 +
         dVar40 * dVar15 * dVar19 +
         ((dVar30 * dVar11 * dVar21 - dVar30 * dVar15 * dVar59) - dVar40 * dVar38 * dVar21)) -
         dVar29 * dVar11 * dVar19;
    calc_realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 9;
    Eigen::Matrix<double,_9,_1,_0,_9,_1>::Matrix<int>
              ((Matrix<double,_9,_1,_0,_9,_1> *)local_1fb8,
               (int *)((long)&calc_realRoots.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)local_1fb8,0);
    *pSVar7 = (dVar26 * dVar36 * dVar56 +
              dVar33 * dVar12 * dVar16 +
              ((dVar23 * dVar39 * dVar60 - dVar23 * dVar12 * dVar56) - dVar33 * dVar36 * dVar60)) -
              dVar26 * dVar39 * dVar16;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)local_1fb8,1);
    *pSVar7 = (dVar27 * dVar36 * dVar56 +
              (((dVar26 * dVar37 * dVar56 +
                dVar26 * dVar36 * dVar57 +
                dVar35 * dVar12 * dVar16 +
                ((dVar33 * dVar13 * dVar16 +
                 dVar33 * dVar12 * dVar17 +
                 ((((dVar25 * dVar39 * dVar60 +
                    (((dVar23 * dVar39 * dVar61 + dVar23 * dVar55 * dVar60) -
                     dVar23 * dVar12 * dVar57) - dVar23 * dVar13 * dVar56)) -
                   dVar25 * dVar12 * dVar56) - dVar33 * dVar36 * dVar61) - dVar33 * dVar37 * dVar60)
                 ) - dVar35 * dVar36 * dVar60)) - dVar26 * dVar39 * dVar17) -
              dVar26 * dVar55 * dVar16)) - dVar27 * dVar39 * dVar16;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)local_1fb8,2);
    *pSVar7 = (dVar28 * dVar36 * dVar56 +
              (((dVar27 * dVar37 * dVar56 +
                dVar27 * dVar36 * dVar57 +
                ((((dVar26 * dVar38 * dVar56 +
                   dVar26 * dVar37 * dVar57 +
                   dVar26 * dVar36 * dVar58 +
                   dVar40 * dVar12 * dVar16 +
                   ((dVar35 * dVar13 * dVar16 +
                    dVar35 * dVar12 * dVar17 +
                    (((dVar33 * dVar14 * dVar16 +
                      dVar33 * dVar13 * dVar17 +
                      dVar33 * dVar12 * dVar18 +
                      (((((dVar30 * dVar39 * dVar60 +
                          (((dVar25 * dVar55 * dVar60 +
                            dVar25 * dVar39 * dVar61 +
                            ((((dVar23 * dVar11 * dVar60 +
                               dVar23 * dVar39 * dVar45 + dVar23 * dVar55 * dVar61) -
                              dVar23 * dVar12 * dVar58) - dVar23 * dVar13 * dVar57) -
                            dVar23 * dVar14 * dVar56)) - dVar25 * dVar12 * dVar57) -
                          dVar25 * dVar13 * dVar56)) - dVar30 * dVar12 * dVar56) -
                        dVar33 * dVar36 * dVar45) - dVar33 * dVar37 * dVar61) -
                      dVar33 * dVar38 * dVar60)) - dVar35 * dVar36 * dVar61) -
                    dVar35 * dVar37 * dVar60)) - dVar40 * dVar36 * dVar60)) -
                  dVar26 * dVar39 * dVar18) - dVar26 * dVar55 * dVar17) - dVar26 * dVar11 * dVar16))
               - dVar27 * dVar39 * dVar17) - dVar27 * dVar55 * dVar16)) - dVar28 * dVar39 * dVar16;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)local_1fb8,3);
    *pSVar7 = (dVar29 * dVar36 * dVar56 +
              (((dVar28 * dVar37 * dVar56 +
                dVar28 * dVar36 * dVar57 +
                ((((dVar27 * dVar38 * dVar56 +
                   dVar27 * dVar37 * dVar57 +
                   dVar27 * dVar36 * dVar58 +
                   ((((dVar26 * dVar38 * dVar57 +
                      dVar26 * dVar37 * dVar58 +
                      dVar26 * dVar36 * dVar59 +
                      dVar40 * dVar13 * dVar16 +
                      dVar40 * dVar12 * dVar17 +
                      (((dVar35 * dVar14 * dVar16 +
                        dVar35 * dVar13 * dVar17 +
                        dVar35 * dVar12 * dVar18 +
                        ((((dVar33 * dVar15 * dVar16 +
                           dVar33 * dVar14 * dVar17 +
                           dVar33 * dVar13 * dVar18 +
                           dVar33 * dVar12 * dVar19 +
                           ((((((dVar30 * dVar55 * dVar60 +
                                dVar30 * dVar39 * dVar61 +
                                ((((dVar25 * dVar11 * dVar60 +
                                   dVar25 * dVar55 * dVar61 +
                                   dVar25 * dVar39 * dVar45 +
                                   (((((dVar23 * dVar11 * dVar61 +
                                       dVar23 * dVar39 * dVar22 + dVar23 * dVar55 * dVar45) -
                                      dVar23 * dVar12 * dVar59) - dVar23 * dVar13 * dVar58) -
                                    dVar23 * dVar14 * dVar57) - dVar23 * dVar15 * dVar56)) -
                                  dVar25 * dVar12 * dVar58) - dVar25 * dVar13 * dVar57) -
                                dVar25 * dVar14 * dVar56)) - dVar30 * dVar12 * dVar57) -
                              dVar30 * dVar13 * dVar56) - dVar33 * dVar36 * dVar22) -
                            dVar33 * dVar37 * dVar45) - dVar33 * dVar38 * dVar61)) -
                          dVar35 * dVar36 * dVar45) - dVar35 * dVar37 * dVar61) -
                        dVar35 * dVar38 * dVar60)) - dVar40 * dVar36 * dVar61) -
                      dVar40 * dVar37 * dVar60)) - dVar26 * dVar39 * dVar19) -
                    dVar26 * dVar55 * dVar18) - dVar26 * dVar11 * dVar17)) -
                  dVar27 * dVar39 * dVar18) - dVar27 * dVar55 * dVar17) - dVar27 * dVar11 * dVar16))
               - dVar28 * dVar39 * dVar17) - dVar28 * dVar55 * dVar16)) - dVar29 * dVar39 * dVar16;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)local_1fb8,4);
    *pSVar7 = ((dVar29 * dVar37 * dVar56 +
               dVar29 * dVar36 * dVar57 +
               ((((dVar28 * dVar38 * dVar56 +
                  dVar28 * dVar37 * dVar57 +
                  dVar28 * dVar36 * dVar58 +
                  ((((dVar27 * dVar38 * dVar57 +
                     dVar27 * dVar37 * dVar58 +
                     dVar27 * dVar36 * dVar59 +
                     (((dVar26 * dVar38 * dVar58 +
                       dVar26 * dVar37 * dVar59 +
                       dVar40 * dVar14 * dVar16 +
                       dVar40 * dVar13 * dVar17 +
                       dVar40 * dVar12 * dVar18 +
                       ((((dVar35 * dVar15 * dVar16 +
                          dVar35 * dVar14 * dVar17 +
                          dVar35 * dVar13 * dVar18 +
                          dVar35 * dVar12 * dVar19 +
                          ((((dVar33 * dVar15 * dVar17 +
                             dVar33 * dVar14 * dVar18 +
                             dVar33 * dVar13 * dVar19 +
                             (((((((dVar30 * dVar11 * dVar60 +
                                   dVar30 * dVar55 * dVar61 +
                                   dVar30 * dVar39 * dVar45 +
                                   (((((dVar25 * dVar11 * dVar61 +
                                       dVar25 * dVar55 * dVar45 +
                                       dVar25 * dVar39 * dVar22 +
                                       ((((dVar23 * dVar11 * dVar45 +
                                          dVar23 * dVar39 * dVar21 + dVar23 * dVar55 * dVar22) -
                                         dVar23 * dVar13 * dVar59) - dVar23 * dVar14 * dVar58) -
                                       dVar23 * dVar15 * dVar57)) - dVar25 * dVar12 * dVar59) -
                                     dVar25 * dVar13 * dVar58) - dVar25 * dVar14 * dVar57) -
                                   dVar25 * dVar15 * dVar56)) - dVar30 * dVar12 * dVar58) -
                                 dVar30 * dVar13 * dVar57) - dVar30 * dVar14 * dVar56) -
                               dVar33 * dVar36 * dVar21) - dVar33 * dVar37 * dVar22) -
                             dVar33 * dVar38 * dVar45)) - dVar35 * dVar36 * dVar22) -
                           dVar35 * dVar37 * dVar45) - dVar35 * dVar38 * dVar61)) -
                         dVar40 * dVar36 * dVar45) - dVar40 * dVar37 * dVar61) -
                       dVar40 * dVar38 * dVar60)) - dVar26 * dVar55 * dVar19) -
                     dVar26 * dVar11 * dVar18)) - dVar27 * dVar39 * dVar19) -
                   dVar27 * dVar55 * dVar18) - dVar27 * dVar11 * dVar17)) - dVar28 * dVar39 * dVar18
                 ) - dVar28 * dVar55 * dVar17) - dVar28 * dVar11 * dVar16)) -
              dVar29 * dVar39 * dVar17) - dVar29 * dVar55 * dVar16;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)local_1fb8,5);
    *pSVar7 = (((dVar29 * dVar38 * dVar56 +
                dVar29 * dVar37 * dVar57 +
                dVar29 * dVar36 * dVar58 +
                ((((dVar28 * dVar38 * dVar57 +
                   dVar28 * dVar37 * dVar58 +
                   dVar28 * dVar36 * dVar59 +
                   (((dVar27 * dVar38 * dVar58 +
                     dVar27 * dVar37 * dVar59 +
                     ((dVar26 * dVar38 * dVar59 +
                      dVar40 * dVar15 * dVar16 +
                      dVar40 * dVar14 * dVar17 +
                      dVar40 * dVar13 * dVar18 +
                      dVar40 * dVar12 * dVar19 +
                      ((((dVar35 * dVar15 * dVar17 +
                         dVar35 * dVar14 * dVar18 +
                         dVar35 * dVar13 * dVar19 +
                         ((((dVar33 * dVar15 * dVar18 +
                            dVar33 * dVar14 * dVar19 +
                            (((((((dVar30 * dVar11 * dVar61 +
                                  dVar30 * dVar55 * dVar45 +
                                  dVar30 * dVar39 * dVar22 +
                                  ((((dVar25 * dVar11 * dVar45 +
                                     dVar25 * dVar55 * dVar22 +
                                     dVar25 * dVar39 * dVar21 +
                                     (((dVar23 * dVar55 * dVar21 + dVar23 * dVar11 * dVar22) -
                                      dVar23 * dVar14 * dVar59) - dVar23 * dVar15 * dVar58)) -
                                    dVar25 * dVar13 * dVar59) - dVar25 * dVar14 * dVar58) -
                                  dVar25 * dVar15 * dVar57)) - dVar30 * dVar12 * dVar59) -
                                dVar30 * dVar13 * dVar58) - dVar30 * dVar14 * dVar57) -
                              dVar30 * dVar15 * dVar56) - dVar33 * dVar37 * dVar21) -
                            dVar33 * dVar38 * dVar22)) - dVar35 * dVar36 * dVar21) -
                          dVar35 * dVar37 * dVar22) - dVar35 * dVar38 * dVar45)) -
                        dVar40 * dVar36 * dVar22) - dVar40 * dVar37 * dVar45) -
                      dVar40 * dVar38 * dVar61)) - dVar26 * dVar11 * dVar19)) -
                    dVar27 * dVar55 * dVar19) - dVar27 * dVar11 * dVar18)) -
                  dVar28 * dVar39 * dVar19) - dVar28 * dVar55 * dVar18) - dVar28 * dVar11 * dVar17))
               - dVar29 * dVar39 * dVar18) - dVar29 * dVar55 * dVar17) - dVar29 * dVar11 * dVar16;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)local_1fb8,6);
    *pSVar7 = (((dVar29 * dVar38 * dVar57 +
                dVar29 * dVar37 * dVar58 +
                dVar29 * dVar36 * dVar59 +
                (((dVar28 * dVar38 * dVar58 +
                  dVar28 * dVar37 * dVar59 +
                  ((dVar27 * dVar38 * dVar59 +
                   dVar40 * dVar15 * dVar17 +
                   dVar40 * dVar14 * dVar18 +
                   dVar40 * dVar13 * dVar19 +
                   ((((dVar35 * dVar15 * dVar18 +
                      dVar35 * dVar14 * dVar19 +
                      (((dVar33 * dVar15 * dVar19 +
                        (((((dVar30 * dVar11 * dVar45 +
                            dVar30 * dVar55 * dVar22 +
                            dVar30 * dVar39 * dVar21 +
                            (((dVar25 * dVar11 * dVar22 +
                              dVar25 * dVar55 * dVar21 +
                              (dVar23 * dVar11 * dVar21 - dVar23 * dVar15 * dVar59)) -
                             dVar25 * dVar14 * dVar59) - dVar25 * dVar15 * dVar58)) -
                           dVar30 * dVar13 * dVar59) - dVar30 * dVar14 * dVar58) -
                         dVar30 * dVar15 * dVar57) - dVar33 * dVar38 * dVar21)) -
                       dVar35 * dVar37 * dVar21) - dVar35 * dVar38 * dVar22)) -
                     dVar40 * dVar36 * dVar21) - dVar40 * dVar37 * dVar22) -
                   dVar40 * dVar38 * dVar45)) - dVar27 * dVar11 * dVar19)) -
                 dVar28 * dVar55 * dVar19) - dVar28 * dVar11 * dVar18)) - dVar29 * dVar39 * dVar19)
              - dVar29 * dVar55 * dVar18) - dVar29 * dVar11 * dVar17;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)local_1fb8,7);
    dVar20 = coeff.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
             array[8];
    *pSVar7 = ((dVar29 * dVar38 * dVar58 +
               dVar29 * dVar37 * dVar59 +
               ((dVar28 * dVar38 * dVar59 +
                dVar40 * dVar15 * dVar18 +
                dVar40 * dVar14 * dVar19 +
                (((dVar35 * dVar15 * dVar19 +
                  ((((dVar30 * dVar11 * dVar22 +
                     dVar30 * dVar55 * dVar21 +
                     (dVar25 * dVar11 * dVar21 - dVar25 * dVar15 * dVar59)) -
                    dVar30 * dVar14 * dVar59) - dVar30 * dVar15 * dVar58) - dVar35 * dVar38 * dVar21
                  )) - dVar40 * dVar37 * dVar21) - dVar40 * dVar38 * dVar22)) -
               dVar28 * dVar11 * dVar19)) - dVar29 * dVar55 * dVar19) - dVar29 * dVar11 * dVar18;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)local_1fb8,8);
    *pSVar7 = dVar20;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &solver.m_eigenSolver.m_tmp.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    Eigen::PolynomialSolver<double,_-1>::PolynomialSolver
              ((PolynomialSolver<double,__1> *)local_20d0);
    local_20d4 = 0;
    IVar8 = Eigen::EigenBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)local_1fb8);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)local_1fb8,
                        IVar8 + -1);
    if ((*pSVar7 != 0.0) || (NAN(*pSVar7))) {
      Eigen::PolynomialSolver<double,-1>::compute<Eigen::Matrix<double,9,1,0,9,1>>
                ((PolynomialSolver<double,_1> *)local_20d0,
                 (Matrix<double,_9,_1,_0,_9,_1> *)local_1fb8);
      local_20e0 = Eigen::NumTraits<double>::dummy_precision();
      Eigen::PolynomialSolverBase<double,-1>::realRoots<std::vector<double,std::allocator<double>>>
                ((PolynomialSolverBase<double,_1> *)local_20d0,
                 (vector<double,_std::allocator<double>_> *)
                 &solver.m_eigenSolver.m_tmp.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 &local_20e0);
      sVar1 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)
                         &solver.m_eigenSolver.m_tmp.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows);
      local_20d4 = (uint)sVar1;
      Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)local_21d8);
      for (local_21dc = 0; local_21dc < local_20d4; local_21dc = local_21dc + 1) {
        Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
                  ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_21d8,4,4);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &solver.m_eigenSolver.m_tmp.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,(ulong)local_21dc);
        y = *pvVar9;
        z = (((((((((((((dVar40 * dVar15 * y * y * y * y * y +
                        dVar40 * dVar14 * y * y * y * y +
                        dVar40 * dVar13 * y * y * y +
                        dVar40 * dVar12 * y * y +
                        dVar35 * dVar15 * y * y * y * y +
                        dVar35 * dVar14 * y * y * y +
                        dVar35 * dVar13 * y * y +
                        dVar35 * dVar12 * y +
                        dVar33 * dVar15 * y * y * y +
                        dVar33 * dVar14 * y * y + dVar33 * dVar12 + dVar33 * dVar13 * y) -
                       dVar26 * dVar39) - dVar26 * dVar55 * y) - dVar26 * dVar11 * y * y) -
                    dVar27 * dVar39 * y) - dVar27 * dVar55 * y * y) - dVar27 * dVar11 * y * y * y) -
                 dVar28 * dVar39 * y * y) - dVar28 * dVar55 * y * y * y) -
               dVar28 * dVar11 * y * y * y * y) - dVar29 * dVar39 * y * y * y) -
             dVar29 * dVar55 * y * y * y * y) - dVar29 * dVar11 * y * y * y * y * y) /
            ((((((((((dVar30 * dVar11 * y * y * y * y +
                     dVar30 * dVar55 * y * y * y +
                     dVar30 * dVar39 * y * y +
                     dVar25 * dVar11 * y * y * y +
                     dVar25 * dVar55 * y * y +
                     dVar25 * dVar39 * y +
                     dVar23 * dVar11 * y * y + dVar23 * dVar39 + dVar23 * dVar55 * y) -
                    dVar33 * dVar36) - dVar33 * dVar37 * y) - dVar33 * dVar38 * y * y) -
                 dVar35 * dVar36 * y) - dVar35 * dVar37 * y * y) - dVar35 * dVar38 * y * y * y) -
              dVar40 * dVar36 * y * y) - dVar40 * dVar37 * y * y * y) -
            dVar40 * dVar38 * y * y * y * y);
        r11 = (dVar29 * dVar38 * y * y * y * y * y +
              dVar29 * dVar37 * y * y * y * y +
              dVar29 * dVar36 * y * y * y +
              dVar28 * dVar38 * y * y * y * y +
              dVar28 * dVar37 * y * y * y +
              dVar28 * dVar36 * y * y +
              dVar27 * dVar38 * y * y * y +
              dVar27 * dVar37 * y * y +
              dVar27 * dVar36 * y +
              dVar26 * dVar38 * y * y +
              dVar26 * dVar37 * y +
              dVar26 * dVar36 +
              (((((((((((-dVar23 * dVar12 - dVar23 * dVar13 * y) - dVar23 * dVar14 * y * y) -
                      dVar23 * dVar15 * y * y * y) - dVar25 * dVar12 * y) - dVar25 * dVar13 * y * y)
                   - dVar25 * dVar14 * y * y * y) - dVar25 * dVar15 * y * y * y * y) -
                 dVar30 * dVar12 * y * y) - dVar30 * dVar13 * y * y * y) -
               dVar30 * dVar14 * y * y * y * y) - dVar30 * dVar15 * y * y * y * y * y)) /
              ((((((((((dVar30 * dVar11 * y * y * y * y +
                       dVar30 * dVar55 * y * y * y +
                       dVar30 * dVar39 * y * y +
                       dVar25 * dVar11 * y * y * y +
                       dVar25 * dVar55 * y * y +
                       dVar25 * dVar39 * y +
                       dVar23 * dVar11 * y * y + dVar23 * dVar39 + dVar23 * dVar55 * y) -
                      dVar33 * dVar36) - dVar33 * dVar37 * y) - dVar33 * dVar38 * y * y) -
                   dVar35 * dVar36 * y) - dVar35 * dVar37 * y * y) - dVar35 * dVar38 * y * y * y) -
                dVar40 * dVar36 * y * y) - dVar40 * dVar37 * y * y * y) -
              dVar40 * dVar38 * y * y * y * y);
        dVar20 = r11 * r11 + z * z + y * y + 1.0;
        r12 = (((y * y + 1.0) - z * z) - r11 * r11) / dVar20;
        r13 = ((y + y) * z - (r11 + r11)) / dVar20;
        r21 = (z + z + (y + y) * r11) / dVar20;
        r22 = ((y + y) * z + r11 + r11) / dVar20;
        r23 = ((z * z + (1.0 - y * y)) - r11 * r11) / dVar20;
        r31 = ((z + z) * r11 - (y + y)) / dVar20;
        r32 = ((y + y) * r11 - (z + z)) / dVar20;
        r33 = (y + y + (z + z) * r11) / dVar20;
        r_ = (r11 * r11 + ((1.0 - y * y) - z * z)) / dVar20;
        Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                  ((Type *)(outi.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array + 0xf),
                   (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_21d8,3,3);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>::
        operator<<(&local_2200,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                   (outi.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array + 0xf),&r12);
        pCVar10 = Eigen::
                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
                  ::operator_(&local_2200,&r13);
        pCVar10 = Eigen::
                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
                  ::operator_(pCVar10,&r21);
        pCVar10 = Eigen::
                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
                  ::operator_(pCVar10,&r22);
        pCVar10 = Eigen::
                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
                  ::operator_(pCVar10,&r23);
        pCVar10 = Eigen::
                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
                  ::operator_(pCVar10,&r31);
        pCVar10 = Eigen::
                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
                  ::operator_(pCVar10,&r32);
        pCVar10 = Eigen::
                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
                  ::operator_(pCVar10,&r33);
        Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
        ::operator_(pCVar10,&r_);
        Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>
        ::~CommaInitializer(&local_2200);
        local_22e8 = (XprTypeNested)
                     Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::inverse
                               ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                                (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array + 0xf));
        PVar63 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>>::operator*
                           ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>> *)
                            &local_22e8,
                            (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_21d8);
        local_22e0 = PVar63;
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>>
        ::operator*(&local_22d0,
                    (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                     *)&local_22e0,
                    (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                    (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array + 0x23));
        Eigen::Matrix<double,4,4,0,4,4>::
        Matrix<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                  ((Matrix<double,4,4,0,4,4> *)local_22b8,
                   (EigenBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                    *)&local_22d0);
        std::
        vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_22b8);
      }
    }
    tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
    _7_1_ = 1;
    x._4_4_ = 1;
    Eigen::PolynomialSolver<double,_-1>::~PolynomialSolver
              ((PolynomialSolver<double,__1> *)local_20d0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               &solver.m_eigenSolver.m_tmp.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::~vector((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
               *)local_10c8);
    if ((tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         ._7_1_ & 1) == 0) {
      std::
      vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ::~vector(__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  this_12 = std::operator<<((ostream *)&std::cerr,
                            "Solver 3L1Q requires at least 1 point, and 3 line pairs!");
  std::ostream::operator<<(this_12,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver3L1Q_New(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{
	// check input vectors size
	if(ptPair.size() < 1 || lPair.size() < 3){
		std::cerr << "Solver 3L1Q requires at least 1 point, and 3 line pairs!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> P1, P1_B, Q11, Q12, R11_B, R12_B, Q21, Q22, R21_B, R22_B, Q31, Q32, R31_B, R32_B;
	P1 = ptPair[0].first; P1_B = ptPair[0].second;

	Q11 = lPair[0].first.first; Q12 = lPair[0].first.second;
	R11_B = lPair[0].second.first; R12_B = lPair[0].second.second;
	Q21 = lPair[1].first.first; Q22 = lPair[1].first.second;
	R21_B = lPair[1].second.first; R22_B = lPair[1].second.second;
	Q31 = lPair[2].first.first; Q32 = lPair[2].first.second;
	R31_B = lPair[2].second.first; R32_B = lPair[2].second.second;


	// initialize the transformation matrix
	vector<Matrix<floatPrec, 4,4>> out;

	Matrix<floatPrec, 3,1> tP11, tP12, tP21, tP22, tP31, tP32, tQ11, tQ12, tQ21, tQ22, tQ31, tQ32;
	// points first lines
	tP11 = Q11.head(3) / Q11(3);
	tP12 = Q12.head(3) / Q12(3);
	tQ11 = R11_B.head(3) / R11_B(3);
	tQ12 = R12_B.head(3) / R12_B(3);
	// points second lines
	tP21 = Q21.head(3) / Q21(3);
	tP22 = Q22.head(3) / Q22(3);
	tQ21 = R21_B.head(3) / R21_B(3);
	tQ22 = R22_B.head(3) / R22_B(3);
	// points third lines
	tP31 = Q31.head(3) / Q31(3);
	tP32 = Q32.head(3) / Q32(3);
	tQ31 = R31_B.head(3) / R31_B(3);
	tQ32 = R32_B.head(3) / R32_B(3);

	// computing the plucker coordinates of the lines
	// ref A
	Matrix<floatPrec, 3,1> D1 = tP12 - tP11;
	Matrix<floatPrec, 6,1> L1;
	L1.head(3) = D1;
	L1.tail(3) = tP12.cross(tP11);
	L1 /= L1.head(3).norm();
	Matrix<floatPrec, 3,1> D2 = tP22 - tP21;
	Matrix<floatPrec, 6,1> L2;
	L2.head(3) = D2;
	L2.tail(3) = tP22.cross(tP21);
	L2 /= L2.head(3).norm();
	Matrix<floatPrec, 3,1> D3 = tP32 - tP31;
	Matrix<floatPrec, 6,1> L3;
	L3.head(3) = D3;
	L3.tail(3) = tP32.cross(tP31);
	L3 /= L3.head(3).norm();
	// ref B
	D1 = tQ12 - tQ11;
	Matrix<floatPrec, 6,1> M1;
	M1.head(3) = D1;
	M1.tail(3) = tQ12.cross(tQ11);
	M1 /= M1.head(3).norm();
	D2 = tQ22 - tQ21;
	Matrix<floatPrec, 6,1> M2;
	M2.head(3) = D2;
	M2.tail(3) = tQ22.cross(tQ21);
	M2 /= M2.head(3).norm();
	D3 = tQ32 - tQ31;
	Matrix<floatPrec, 6,1> M3;
	M3.head(3) = D3;
	M3.tail(3) = tQ32.cross(tQ31);
	M3 /= M3.head(3).norm();

	// compute predefined transformations
	vector<Matrix<floatPrec, 4,4>> predTrans = getPredefinedTransformations3L1Q(P1, P1_B);
	Matrix<floatPrec, 4,4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4,4> TU = predTrans.back();
	predTrans.pop_back();

	// transform lines to predefined frames
	Matrix<floatPrec, 6,6> transLineU, transLineV;
	transLineU.setZero();
	transLineV.setZero();
	transLineU.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	transLineV.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);

	Matrix<floatPrec, 6,1> L1_1, L2_1, L3_1, M1_1, M2_1, M3_1;
	L1_1 = transLineU * L1;
	L2_1 = transLineU * L2;
	L3_1 = transLineU * L3;
	M1_1 = transLineV * M1;
	M2_1 = transLineV * M2;
	M3_1 = transLineV * M3;

	floatPrec l11, l12, l13, l14, l15, l16, l21, l22, l23, l24, l25, l26, l31, l32, l33, l34, l35, l36;
	floatPrec m11, m12, m13, m14, m15, m16, m21, m22, m23, m24, m25, m26, m31, m32, m33, m34, m35, m36;

	l11 = L1_1[0];
	l12 = L1_1[1];
	l13 = L1_1[2];
	l14 = L1_1[3];
	l15 = L1_1[4];
	l16 = L1_1[5];
	l21 = L2_1[0];
	l22 = L2_1[1];
	l23 = L2_1[2];
	l24 = L2_1[3];
	l25 = L2_1[4];
	l26 = L2_1[5];
	l31 = L3_1[0];
	l32 = L3_1[1];
	l33 = L3_1[2];
	l34 = L3_1[3];
	l35 = L3_1[4];
	l36 = L3_1[5];
	
	m11 = M1_1[0];
	m12 = M1_1[1];
	m13 = M1_1[2];
	m14 = M1_1[3];
	m15 = M1_1[4];
	m16 = M1_1[5];
	m21 = M2_1[0];
	m22 = M2_1[1];
	m23 = M2_1[2];
	m24 = M2_1[3];
	m25 = M2_1[4];
	m26 = M2_1[5];
	m31 = M3_1[0];
	m32 = M3_1[1];
	m33 = M3_1[2];
	m34 = M3_1[3];
	m35 = M3_1[4];
	m36 = M3_1[5];

	floatPrec k1_0, k1_1, k1_2, k1_3, k1_4, k1_5, k1_6, k1_7, k1_8, k1_9;
	k1_0 = l11*m14 + l12*m15 + l13*m16 + l14*m11 + l15*m12 + l16*m13;
	k1_1 = 2*l11*m15 - 2*l12*m14 + 2*l14*m12 - 2*l15*m11;
	k1_2 = -l11*m14 - l12*m15 + l13*m16 - l14*m11 - l15*m12 + l16*m13;
	k1_3 = -2*l11*m16 + 2*l13*m14 - 2*l14*m13 + 2*l16*m11;
	k1_4 = 2*l12*m16 + 2*l13*m15 + 2*l15*m13 + 2*l16*m12;
	k1_5 = -l11*m14 + l12*m15 - l13*m16 - l14*m11 + l15*m12 - l16*m13;
	k1_6 = 2*l12*m16 - 2*l13*m15 + 2*l15*m13 - 2*l16*m12;
	k1_7 = 2*l11*m16 + 2*l13*m14 + 2*l14*m13 + 2*l16*m11;
	k1_8 = 2*l11*m15 + 2*l12*m14 + 2*l14*m12 + 2*l15*m11;
	k1_9 = l11*m14 - l12*m15 - l13*m16 + l14*m11 - l15*m12 - l16*m13;

	floatPrec k2_0, k2_1, k2_2, k2_3, k2_4, k2_5, k2_6, k2_7, k2_8, k2_9;
	k2_0 = l21*m24 + l22*m25 + l23*m26 + l24*m21 + l25*m22 + l26*m23;
	k2_1 = 2*l21*m25 - 2*l22*m24 + 2*l24*m22 - 2*l25*m21;
	k2_2 = -l21*m24 - l22*m25 + l23*m26 - l24*m21 - l25*m22 + l26*m23;
	k2_3 = -2*l21*m26 + 2*l23*m24 - 2*l24*m23 + 2*l26*m21;
	k2_4 = 2*l22*m26 + 2*l23*m25 + 2*l25*m23 + 2*l26*m22;
	k2_5 = -l21*m24 + l22*m25 - l23*m26 - l24*m21 + l25*m22 - l26*m23;
	k2_6 = 2*l22*m26 - 2*l23*m25 + 2*l25*m23 - 2*l26*m22;
	k2_7 = 2*l21*m26 + 2*l23*m24 + 2*l24*m23 + 2*l26*m21;
	k2_8 = 2*l21*m25 + 2*l22*m24 + 2*l24*m22 + 2*l25*m21;
	k2_9 = l21*m24 - l22*m25 - l23*m26 + l24*m21 - l25*m22 - l26*m23;

	floatPrec k3_0, k3_1, k3_2, k3_3, k3_4, k3_5, k3_6, k3_7, k3_8, k3_9;
	k3_0 = l31*m34 + l32*m35 + l33*m36 + l34*m31 + l35*m32 + l36*m33;
	k3_1 = 2*l31*m35 - 2*l32*m34 + 2*l34*m32 - 2*l35*m31;
	k3_2 = -l31*m34 - l32*m35 + l33*m36 - l34*m31 - l35*m32 + l36*m33;
	k3_3 = -2*l31*m36 + 2*l33*m34 - 2*l34*m33 + 2*l36*m31;
	k3_4 = 2*l32*m36 + 2*l33*m35 + 2*l35*m33 + 2*l36*m32;
	k3_5 = -l31*m34 + l32*m35 - l33*m36 - l34*m31 + l35*m32 - l36*m33;
	k3_6 = 2*l32*m36 - 2*l33*m35 + 2*l35*m33 - 2*l36*m32;
	k3_7 = 2*l31*m36 + 2*l33*m34 + 2*l34*m33 + 2*l36*m31;
	k3_8 = 2*l31*m35 + 2*l32*m34 + 2*l34*m32 + 2*l35*m31;
	k3_9 = l31*m34 - l32*m35 - l33*m36 + l34*m31 - l35*m32 - l36*m33;

	floatPrec m1_0, m1_1;
	m1_0 = (k1_2*k2_3*k3_4 - k1_2*k2_4*k3_3 - k1_3*k2_2*k3_4 + k1_3*k2_4*k3_2 + k1_4*k2_2*k3_3 - k1_4*k2_3*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m1_1 = (-k1_2*k2_4*k3_8 + k1_2*k2_8*k3_4 + k1_4*k2_2*k3_8 - k1_4*k2_8*k3_2 - k1_8*k2_2*k3_4 + k1_8*k2_4*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m2_0, m2_1;
	m2_0 = (-k1_1*k2_2*k3_4 + k1_1*k2_4*k3_2 + k1_2*k2_1*k3_4 - k1_2*k2_4*k3_1 - k1_4*k2_1*k3_2 + k1_4*k2_2*k3_1)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m2_1 = (-k1_2*k2_4*k3_7 + k1_2*k2_7*k3_4 + k1_4*k2_2*k3_7 - k1_4*k2_7*k3_2 - k1_7*k2_2*k3_4 + k1_7*k2_4*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m3_0, m3_1, m3_2;
	m3_0 = (-k1_0*k2_2*k3_4 + k1_0*k2_4*k3_2 + k1_2*k2_0*k3_4 - k1_2*k2_4*k3_0 - k1_4*k2_0*k3_2 + k1_4*k2_2*k3_0)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m3_1 = (-k1_2*k2_4*k3_6 + k1_2*k2_6*k3_4 + k1_4*k2_2*k3_6 - k1_4*k2_6*k3_2 - k1_6*k2_2*k3_4 + k1_6*k2_4*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m3_2 = (-k1_2*k2_4*k3_9 + k1_2*k2_9*k3_4 + k1_4*k2_2*k3_9 - k1_4*k2_9*k3_2 - k1_9*k2_2*k3_4 + k1_9*k2_4*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m4_0, m4_1;
	m4_0 = (-k1_3*k2_4*k3_5 + k1_3*k2_5*k3_4 + k1_4*k2_3*k3_5 - k1_4*k2_5*k3_3 - k1_5*k2_3*k3_4 + k1_5*k2_4*k3_3)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m4_1 = (-k1_4*k2_5*k3_8 + k1_4*k2_8*k3_5 + k1_5*k2_4*k3_8 - k1_5*k2_8*k3_4 - k1_8*k2_4*k3_5 + k1_8*k2_5*k3_4)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m5_0, m5_1;
	m5_0 = (-k1_1*k2_4*k3_5 + k1_1*k2_5*k3_4 + k1_4*k2_1*k3_5 - k1_4*k2_5*k3_1 - k1_5*k2_1*k3_4 + k1_5*k2_4*k3_1)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m5_1 = (-k1_4*k2_5*k3_7 + k1_4*k2_7*k3_5 + k1_5*k2_4*k3_7 - k1_5*k2_7*k3_4 - k1_7*k2_4*k3_5 + k1_7*k2_5*k3_4)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m6_0, m6_1, m6_2;
	m6_0 = (-k1_0*k2_4*k3_5 + k1_0*k2_5*k3_4 + k1_4*k2_0*k3_5 - k1_4*k2_5*k3_0 - k1_5*k2_0*k3_4 + k1_5*k2_4*k3_0)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m6_1 = (-k1_4*k2_5*k3_6 + k1_4*k2_6*k3_5 + k1_5*k2_4*k3_6 - k1_5*k2_6*k3_4 - k1_6*k2_4*k3_5 + k1_6*k2_5*k3_4)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m6_2 = (-k1_4*k2_5*k3_9 + k1_4*k2_9*k3_5 + k1_5*k2_4*k3_9 - k1_5*k2_9*k3_4 - k1_9*k2_4*k3_5 + k1_9*k2_5*k3_4)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m7_0, m7_1;
	m7_0 = (-k1_2*k2_3*k3_5 + k1_2*k2_5*k3_3 + k1_3*k2_2*k3_5 - k1_3*k2_5*k3_2 - k1_5*k2_2*k3_3 + k1_5*k2_3*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m7_1 = (k1_2*k2_5*k3_8 - k1_2*k2_8*k3_5 - k1_5*k2_2*k3_8 + k1_5*k2_8*k3_2 + k1_8*k2_2*k3_5 - k1_8*k2_5*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m8_0, m8_1;
	m8_0 = (k1_1*k2_2*k3_5 - k1_1*k2_5*k3_2 - k1_2*k2_1*k3_5 + k1_2*k2_5*k3_1 + k1_5*k2_1*k3_2 - k1_5*k2_2*k3_1)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m8_1 = (k1_2*k2_5*k3_7 - k1_2*k2_7*k3_5 - k1_5*k2_2*k3_7 + k1_5*k2_7*k3_2 + k1_7*k2_2*k3_5 - k1_7*k2_5*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec m9_0, m9_1, m9_2;
	m9_0 = (k1_0*k2_2*k3_5 - k1_0*k2_5*k3_2 - k1_2*k2_0*k3_5 + k1_2*k2_5*k3_0 + k1_5*k2_0*k3_2 - k1_5*k2_2*k3_0)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m9_1 = (k1_2*k2_5*k3_6 - k1_2*k2_6*k3_5 - k1_5*k2_2*k3_6 + k1_5*k2_6*k3_2 + k1_6*k2_2*k3_5 - k1_6*k2_5*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);
	m9_2 = (k1_2*k2_5*k3_9 - k1_2*k2_9*k3_5 - k1_5*k2_2*k3_9 + k1_5*k2_9*k3_2 + k1_9*k2_2*k3_5 - k1_9*k2_5*k3_2)/(k1_2*k2_4*k3_5 - k1_2*k2_5*k3_4 - k1_4*k2_2*k3_5 + k1_4*k2_5*k3_2 + k1_5*k2_2*k3_4 - k1_5*k2_4*k3_2);

	floatPrec n1_0, n1_1, n1_2;
	n1_0 = m2_0*m4_0 - m7_0*m8_0 - m9_0;
	n1_1 = m2_0*m4_1 + m2_1*m4_0 - m7_0*m8_1 - m7_1*m8_0 - m9_1;
	n1_2 = m2_1*m4_1 - m7_1*m8_1 - m9_2;

	floatPrec n2_0, n2_1, n2_2;
	n2_0 = m1_0*m8_0 + m2_0*m5_0 - m2_0*m7_0 + m3_0 - m8_0*m8_0;
	n2_1 = m1_0*m8_1 + m1_1*m8_0 + m2_0*m5_1 - m2_0*m7_1 + m2_1*m5_0 - m2_1*m7_0 + m3_1 - 2*m8_0*m8_1;
	n2_2 = m1_1*m8_1 + m2_1*m5_1 - m2_1*m7_1 + m3_2 - m8_1*m8_1;

	floatPrec n3_0, n3_1, n3_2, n3_3;
	n3_0 = m1_0*m9_0 + m2_0*m6_0 - m3_0*m7_0 - m8_0*m9_0;
	n3_1 = m1_0*m9_1 + m1_1*m9_0 + m2_0*m6_1 + m2_1*m6_0 - m3_0*m7_1 - m3_1*m7_0 - m8_0*m9_1 - m8_1*m9_0;
	n3_2 = m1_0*m9_2 + m1_1*m9_1 + m2_0*m6_2 + m2_1*m6_1 - m3_1*m7_1 - m3_2*m7_0 - m8_0*m9_2 - m8_1*m9_1;
	n3_3 = m1_1*m9_2 + m2_1*m6_2 - m3_2*m7_1 - m8_1*m9_2;

	floatPrec n4_0, n4_1, n4_2;
	n4_0 = -m1_0*m4_0 + m4_0*m8_0 - m5_0*m7_0 - m6_0 + m7_0*m7_0;
	n4_1 = -m1_0*m4_1 - m1_1*m4_0 + m4_0*m8_1 + m4_1*m8_0 - m5_0*m7_1 - m5_1*m7_0 - m6_1 + 2*m7_0*m7_1;
	n4_2 = -m1_1*m4_1 + m4_1*m8_1 - m5_1*m7_1 - m6_2 + m7_1*m7_1;

	floatPrec n5_0, n5_1, n5_2;
	n5_0 = -m2_0*m4_0 + m7_0*m8_0 + m9_0;
	n5_1 = -m2_0*m4_1 - m2_1*m4_0 + m7_0*m8_1 + m7_1*m8_0 + m9_1;
	n5_2 = -m2_1*m4_1 + m7_1*m8_1 + m9_2;

	floatPrec n6_0, n6_1, n6_2, n6_3;
	n6_0 = -m3_0*m4_0 - m5_0*m9_0 + m6_0*m8_0 + m7_0*m9_0;
	n6_1 = -m3_0*m4_1 - m3_1*m4_0 - m5_0*m9_1 - m5_1*m9_0 + m6_0*m8_1 + m6_1*m8_0 + m7_0*m9_1 + m7_1*m9_0;
	n6_2 = -m3_1*m4_1 - m3_2*m4_0 - m5_0*m9_2 - m5_1*m9_1 + m6_1*m8_1 + m6_2*m8_0 + m7_0*m9_2 + m7_1*m9_1;
	n6_3 = -m3_2*m4_1 - m5_1*m9_2 + m6_2*m8_1 + m7_1*m9_2;

	floatPrec n7_0, n7_1, n7_2, n7_3;
	n7_0 = -m1_0*m1_0*m4_0 - m1_0*m5_0*m7_0 - m1_0*m6_0 + m1_0*m7_0*m7_0 - m2_0*m4_0*m5_0 - m2_0*m4_0*m7_0 - m3_0*m4_0 + m4_0*m8_0*m8_0 + 2*m7_0*m7_0*m8_0 + 2*m7_0*m9_0;
	n7_1 = -m1_0*m1_0*m4_1 - 2*m1_0*m1_1*m4_0 - m1_0*m5_0*m7_1 - m1_0*m5_1*m7_0 - m1_0*m6_1 + 2*m1_0*m7_0*m7_1 - m1_1*m5_0*m7_0 - m1_1*m6_0 + m1_1*m7_0*m7_0 - m2_0*m4_0*m5_1 - m2_0*m4_0*m7_1 - m2_0*m4_1*m5_0 - m2_0*m4_1*m7_0 - m2_1*m4_0*m5_0 - m2_1*m4_0*m7_0 - m3_0*m4_1 - m3_1*m4_0 + 2*m4_0*m8_0*m8_1 + m4_1*m8_0*m8_0 + 2*m7_0*m7_0*m8_1 + 4*m7_0*m7_1*m8_0 + 2*m7_0*m9_1 + 2*m7_1*m9_0;
	n7_2 = -2*m1_0*m1_1*m4_1 - m1_0*m5_1*m7_1 - m1_0*m6_2 + m1_0*m7_1*m7_1 - m1_1*m1_1*m4_0 - m1_1*m5_0*m7_1 - m1_1*m5_1*m7_0 - m1_1*m6_1 + 2*m1_1*m7_0*m7_1 - m2_0*m4_1*m5_1 - m2_0*m4_1*m7_1 - m2_1*m4_0*m5_1 - m2_1*m4_0*m7_1 - m2_1*m4_1*m5_0 - m2_1*m4_1*m7_0 - m3_1*m4_1 - m3_2*m4_0 + m4_0*m8_1*m8_1 + 2*m4_1*m8_0*m8_1 + 4*m7_0*m7_1*m8_1 + 2*m7_0*m9_2 + 2*m7_1*m7_1*m8_0 + 2*m7_1*m9_1;
	n7_3 = -m1_1*m1_1*m4_1 - m1_1*m5_1*m7_1 - m1_1*m6_2 + m1_1*m7_1*m7_1 - m2_1*m4_1*m5_1 - m2_1*m4_1*m7_1 - m3_2*m4_1 + m4_1*m8_1*m8_1 + 2*m7_1*m7_1*m8_1 + 2*m7_1*m9_2;

	floatPrec n8_0, n8_1, n8_2, n8_3;
	n8_0 = -m1_0*m2_0*m4_0 - m1_0*m5_0*m8_0 - m2_0*m4_0*m8_0 - m2_0*m5_0*m5_0 - m2_0*m6_0 + m2_0*m7_0*m7_0 - m3_0*m5_0 + m5_0*m8_0*m8_0 + 2*m7_0*m8_0*m8_0 + 2*m8_0*m9_0;
	n8_1 = -m1_0*m2_0*m4_1 - m1_0*m2_1*m4_0 - m1_0*m5_0*m8_1 - m1_0*m5_1*m8_0 - m1_1*m2_0*m4_0 - m1_1*m5_0*m8_0 - m2_0*m4_0*m8_1 - m2_0*m4_1*m8_0 - 2*m2_0*m5_0*m5_1 - m2_0*m6_1 + 2*m2_0*m7_0*m7_1 - m2_1*m4_0*m8_0 - m2_1*m5_0*m5_0 - m2_1*m6_0 + m2_1*m7_0*m7_0 - m3_0*m5_1 - m3_1*m5_0 + 2*m5_0*m8_0*m8_1 + m5_1*m8_0*m8_0 + 4*m7_0*m8_0*m8_1 + 2*m7_1*m8_0*m8_0 + 2*m8_0*m9_1 + 2*m8_1*m9_0;
	n8_2 = -m1_0*m2_1*m4_1 - m1_0*m5_1*m8_1 - m1_1*m2_0*m4_1 - m1_1*m2_1*m4_0 - m1_1*m5_0*m8_1 - m1_1*m5_1*m8_0 - m2_0*m4_1*m8_1 - m2_0*m5_1*m5_1 - m2_0*m6_2 + m2_0*m7_1*m7_1 - m2_1*m4_0*m8_1 - m2_1*m4_1*m8_0 - 2*m2_1*m5_0*m5_1 - m2_1*m6_1 + 2*m2_1*m7_0*m7_1 - m3_1*m5_1 - m3_2*m5_0 + m5_0*m8_1*m8_1 + 2*m5_1*m8_0*m8_1 + 2*m7_0*m8_1*m8_1 + 4*m7_1*m8_0*m8_1 + 2*m8_0*m9_2 + 2*m8_1*m9_1;
	n8_3 = -m1_1*m2_1*m4_1 - m1_1*m5_1*m8_1 - m2_1*m4_1*m8_1 - m2_1*m5_1*m5_1 - m2_1*m6_2 + m2_1*m7_1*m7_1 - m3_2*m5_1 + m5_1*m8_1*m8_1 + 2*m7_1*m8_1*m8_1 + 2*m8_1*m9_2;

	floatPrec n9_0, n9_1, n9_2, n9_3, n9_4;
	n9_0 = -m1_0*m3_0*m4_0 - m1_0*m5_0*m9_0 - m2_0*m4_0*m9_0 - m2_0*m5_0*m6_0 - m3_0*m6_0 + m3_0*m7_0*m7_0 + m6_0*m8_0*m8_0 + 2*m7_0*m8_0*m9_0 + m9_0*m9_0;
	n9_1 = -m1_0*m3_0*m4_1 - m1_0*m3_1*m4_0 - m1_0*m5_0*m9_1 - m1_0*m5_1*m9_0 - m1_1*m3_0*m4_0 - m1_1*m5_0*m9_0 - m2_0*m4_0*m9_1 - m2_0*m4_1*m9_0 - m2_0*m5_0*m6_1 - m2_0*m5_1*m6_0 - m2_1*m4_0*m9_0 - m2_1*m5_0*m6_0 - m3_0*m6_1 + 2*m3_0*m7_0*m7_1 - m3_1*m6_0 + m3_1*m7_0*m7_0 + 2*m6_0*m8_0*m8_1 + m6_1*m8_0*m8_0 + 2*m7_0*m8_0*m9_1 + 2*m7_0*m8_1*m9_0 + 2*m7_1*m8_0*m9_0 + 2*m9_0*m9_1;
	n9_2 = -m1_0*m3_1*m4_1 - m1_0*m3_2*m4_0 - m1_0*m5_0*m9_2 - m1_0*m5_1*m9_1 - m1_1*m3_0*m4_1 - m1_1*m3_1*m4_0 - m1_1*m5_0*m9_1 - m1_1*m5_1*m9_0 - m2_0*m4_0*m9_2 - m2_0*m4_1*m9_1 - m2_0*m5_0*m6_2 - m2_0*m5_1*m6_1 - m2_1*m4_0*m9_1 - m2_1*m4_1*m9_0 - m2_1*m5_0*m6_1 - m2_1*m5_1*m6_0 - m3_0*m6_2 + m3_0*m7_1*m7_1 - m3_1*m6_1 + 2*m3_1*m7_0*m7_1 - m3_2*m6_0 + m3_2*m7_0*m7_0 + m6_0*m8_1*m8_1 + 2*m6_1*m8_0*m8_1 + m6_2*m8_0*m8_0 + 2*m7_0*m8_0*m9_2 + 2*m7_0*m8_1*m9_1 + 2*m7_1*m8_0*m9_1 + 2*m7_1*m8_1*m9_0 + 2*m9_0*m9_2 + m9_1*m9_1;
	n9_3 = -m1_0*m3_2*m4_1 - m1_0*m5_1*m9_2 - m1_1*m3_1*m4_1 - m1_1*m3_2*m4_0 - m1_1*m5_0*m9_2 - m1_1*m5_1*m9_1 - m2_0*m4_1*m9_2 - m2_0*m5_1*m6_2 - m2_1*m4_0*m9_2 - m2_1*m4_1*m9_1 - m2_1*m5_0*m6_2 - m2_1*m5_1*m6_1 - m3_1*m6_2 + m3_1*m7_1*m7_1 - m3_2*m6_1 + 2*m3_2*m7_0*m7_1 + m6_1*m8_1*m8_1 + 2*m6_2*m8_0*m8_1 + 2*m7_0*m8_1*m9_2 + 2*m7_1*m8_0*m9_2 + 2*m7_1*m8_1*m9_1 + 2*m9_1*m9_2;
	n9_4 = -m1_1*m3_2*m4_1 - m1_1*m5_1*m9_2 - m2_1*m4_1*m9_2 - m2_1*m5_1*m6_2 - m3_2*m6_2 + m3_2*m7_1*m7_1 + m6_2*m8_1*m8_1 + 2*m7_1*m8_1*m9_2 + m9_2*m9_2;

	floatPrec o7_0, o7_1, o7_2, o7_3, o7_4, o7_5, o7_6, o7_7, o7_8;
	o7_0 = n1_0*n5_0*n9_0 - n1_0*n6_0*n8_0 - n2_0*n4_0*n9_0 + n2_0*n6_0*n7_0 + n3_0*n4_0*n8_0 - n3_0*n5_0*n7_0;
	o7_1 = n1_0*n5_0*n9_1 + n1_0*n5_1*n9_0 - n1_0*n6_0*n8_1 - n1_0*n6_1*n8_0 + n1_1*n5_0*n9_0 - n1_1*n6_0*n8_0 - n2_0*n4_0*n9_1 - n2_0*n4_1*n9_0 + n2_0*n6_0*n7_1 + n2_0*n6_1*n7_0 - n2_1*n4_0*n9_0 + n2_1*n6_0*n7_0 + n3_0*n4_0*n8_1 + n3_0*n4_1*n8_0 - n3_0*n5_0*n7_1 - n3_0*n5_1*n7_0 + n3_1*n4_0*n8_0 - n3_1*n5_0*n7_0;
	o7_2 = n1_0*n5_0*n9_2 + n1_0*n5_1*n9_1 + n1_0*n5_2*n9_0 - n1_0*n6_0*n8_2 - n1_0*n6_1*n8_1 - n1_0*n6_2*n8_0 + n1_1*n5_0*n9_1 + n1_1*n5_1*n9_0 - n1_1*n6_0*n8_1 - n1_1*n6_1*n8_0 + n1_2*n5_0*n9_0 - n1_2*n6_0*n8_0 - n2_0*n4_0*n9_2 - n2_0*n4_1*n9_1 - n2_0*n4_2*n9_0 + n2_0*n6_0*n7_2 + n2_0*n6_1*n7_1 + n2_0*n6_2*n7_0 - n2_1*n4_0*n9_1 - n2_1*n4_1*n9_0 + n2_1*n6_0*n7_1 + n2_1*n6_1*n7_0 - n2_2*n4_0*n9_0 + n2_2*n6_0*n7_0 + n3_0*n4_0*n8_2 + n3_0*n4_1*n8_1 + n3_0*n4_2*n8_0 - n3_0*n5_0*n7_2 - n3_0*n5_1*n7_1 - n3_0*n5_2*n7_0 + n3_1*n4_0*n8_1 + n3_1*n4_1*n8_0 - n3_1*n5_0*n7_1 - n3_1*n5_1*n7_0 + n3_2*n4_0*n8_0 - n3_2*n5_0*n7_0;
	o7_3 = n1_0*n5_0*n9_3 + n1_0*n5_1*n9_2 + n1_0*n5_2*n9_1 - n1_0*n6_0*n8_3 - n1_0*n6_1*n8_2 - n1_0*n6_2*n8_1 - n1_0*n6_3*n8_0 + n1_1*n5_0*n9_2 + n1_1*n5_1*n9_1 + n1_1*n5_2*n9_0 - n1_1*n6_0*n8_2 - n1_1*n6_1*n8_1 - n1_1*n6_2*n8_0 + n1_2*n5_0*n9_1 + n1_2*n5_1*n9_0 - n1_2*n6_0*n8_1 - n1_2*n6_1*n8_0 - n2_0*n4_0*n9_3 - n2_0*n4_1*n9_2 - n2_0*n4_2*n9_1 + n2_0*n6_0*n7_3 + n2_0*n6_1*n7_2 + n2_0*n6_2*n7_1 + n2_0*n6_3*n7_0 - n2_1*n4_0*n9_2 - n2_1*n4_1*n9_1 - n2_1*n4_2*n9_0 + n2_1*n6_0*n7_2 + n2_1*n6_1*n7_1 + n2_1*n6_2*n7_0 - n2_2*n4_0*n9_1 - n2_2*n4_1*n9_0 + n2_2*n6_0*n7_1 + n2_2*n6_1*n7_0 + n3_0*n4_0*n8_3 + n3_0*n4_1*n8_2 + n3_0*n4_2*n8_1 - n3_0*n5_0*n7_3 - n3_0*n5_1*n7_2 - n3_0*n5_2*n7_1 + n3_1*n4_0*n8_2 + n3_1*n4_1*n8_1 + n3_1*n4_2*n8_0 - n3_1*n5_0*n7_2 - n3_1*n5_1*n7_1 - n3_1*n5_2*n7_0 + n3_2*n4_0*n8_1 + n3_2*n4_1*n8_0 - n3_2*n5_0*n7_1 - n3_2*n5_1*n7_0 + n3_3*n4_0*n8_0 - n3_3*n5_0*n7_0;
	o7_4 = n1_0*n5_0*n9_4 + n1_0*n5_1*n9_3 + n1_0*n5_2*n9_2 - n1_0*n6_1*n8_3 - n1_0*n6_2*n8_2 - n1_0*n6_3*n8_1 + n1_1*n5_0*n9_3 + n1_1*n5_1*n9_2 + n1_1*n5_2*n9_1 - n1_1*n6_0*n8_3 - n1_1*n6_1*n8_2 - n1_1*n6_2*n8_1 - n1_1*n6_3*n8_0 + n1_2*n5_0*n9_2 + n1_2*n5_1*n9_1 + n1_2*n5_2*n9_0 - n1_2*n6_0*n8_2 - n1_2*n6_1*n8_1 - n1_2*n6_2*n8_0 - n2_0*n4_0*n9_4 - n2_0*n4_1*n9_3 - n2_0*n4_2*n9_2 + n2_0*n6_1*n7_3 + n2_0*n6_2*n7_2 + n2_0*n6_3*n7_1 - n2_1*n4_0*n9_3 - n2_1*n4_1*n9_2 - n2_1*n4_2*n9_1 + n2_1*n6_0*n7_3 + n2_1*n6_1*n7_2 + n2_1*n6_2*n7_1 + n2_1*n6_3*n7_0 - n2_2*n4_0*n9_2 - n2_2*n4_1*n9_1 - n2_2*n4_2*n9_0 + n2_2*n6_0*n7_2 + n2_2*n6_1*n7_1 + n2_2*n6_2*n7_0 + n3_0*n4_1*n8_3 + n3_0*n4_2*n8_2 - n3_0*n5_1*n7_3 - n3_0*n5_2*n7_2 + n3_1*n4_0*n8_3 + n3_1*n4_1*n8_2 + n3_1*n4_2*n8_1 - n3_1*n5_0*n7_3 - n3_1*n5_1*n7_2 - n3_1*n5_2*n7_1 + n3_2*n4_0*n8_2 + n3_2*n4_1*n8_1 + n3_2*n4_2*n8_0 - n3_2*n5_0*n7_2 - n3_2*n5_1*n7_1 - n3_2*n5_2*n7_0 + n3_3*n4_0*n8_1 + n3_3*n4_1*n8_0 - n3_3*n5_0*n7_1 - n3_3*n5_1*n7_0;
	o7_5 = n1_0*n5_1*n9_4 + n1_0*n5_2*n9_3 - n1_0*n6_2*n8_3 - n1_0*n6_3*n8_2 + n1_1*n5_0*n9_4 + n1_1*n5_1*n9_3 + n1_1*n5_2*n9_2 - n1_1*n6_1*n8_3 - n1_1*n6_2*n8_2 - n1_1*n6_3*n8_1 + n1_2*n5_0*n9_3 + n1_2*n5_1*n9_2 + n1_2*n5_2*n9_1 - n1_2*n6_0*n8_3 - n1_2*n6_1*n8_2 - n1_2*n6_2*n8_1 - n1_2*n6_3*n8_0 - n2_0*n4_1*n9_4 - n2_0*n4_2*n9_3 + n2_0*n6_2*n7_3 + n2_0*n6_3*n7_2 - n2_1*n4_0*n9_4 - n2_1*n4_1*n9_3 - n2_1*n4_2*n9_2 + n2_1*n6_1*n7_3 + n2_1*n6_2*n7_2 + n2_1*n6_3*n7_1 - n2_2*n4_0*n9_3 - n2_2*n4_1*n9_2 - n2_2*n4_2*n9_1 + n2_2*n6_0*n7_3 + n2_2*n6_1*n7_2 + n2_2*n6_2*n7_1 + n2_2*n6_3*n7_0 + n3_0*n4_2*n8_3 - n3_0*n5_2*n7_3 + n3_1*n4_1*n8_3 + n3_1*n4_2*n8_2 - n3_1*n5_1*n7_3 - n3_1*n5_2*n7_2 + n3_2*n4_0*n8_3 + n3_2*n4_1*n8_2 + n3_2*n4_2*n8_1 - n3_2*n5_0*n7_3 - n3_2*n5_1*n7_2 - n3_2*n5_2*n7_1 + n3_3*n4_0*n8_2 + n3_3*n4_1*n8_1 + n3_3*n4_2*n8_0 - n3_3*n5_0*n7_2 - n3_3*n5_1*n7_1 - n3_3*n5_2*n7_0;
	o7_6 = n1_0*n5_2*n9_4 - n1_0*n6_3*n8_3 + n1_1*n5_1*n9_4 + n1_1*n5_2*n9_3 - n1_1*n6_2*n8_3 - n1_1*n6_3*n8_2 + n1_2*n5_0*n9_4 + n1_2*n5_1*n9_3 + n1_2*n5_2*n9_2 - n1_2*n6_1*n8_3 - n1_2*n6_2*n8_2 - n1_2*n6_3*n8_1 - n2_0*n4_2*n9_4 + n2_0*n6_3*n7_3 - n2_1*n4_1*n9_4 - n2_1*n4_2*n9_3 + n2_1*n6_2*n7_3 + n2_1*n6_3*n7_2 - n2_2*n4_0*n9_4 - n2_2*n4_1*n9_3 - n2_2*n4_2*n9_2 + n2_2*n6_1*n7_3 + n2_2*n6_2*n7_2 + n2_2*n6_3*n7_1 + n3_1*n4_2*n8_3 - n3_1*n5_2*n7_3 + n3_2*n4_1*n8_3 + n3_2*n4_2*n8_2 - n3_2*n5_1*n7_3 - n3_2*n5_2*n7_2 + n3_3*n4_0*n8_3 + n3_3*n4_1*n8_2 + n3_3*n4_2*n8_1 - n3_3*n5_0*n7_3 - n3_3*n5_1*n7_2 - n3_3*n5_2*n7_1;
	o7_7 = n1_1*n5_2*n9_4 - n1_1*n6_3*n8_3 + n1_2*n5_1*n9_4 + n1_2*n5_2*n9_3 - n1_2*n6_2*n8_3 - n1_2*n6_3*n8_2 - n2_1*n4_2*n9_4 + n2_1*n6_3*n7_3 - n2_2*n4_1*n9_4 - n2_2*n4_2*n9_3 + n2_2*n6_2*n7_3 + n2_2*n6_3*n7_2 + n3_2*n4_2*n8_3 - n3_2*n5_2*n7_3 + n3_3*n4_1*n8_3 + n3_3*n4_2*n8_2 - n3_3*n5_1*n7_3 - n3_3*n5_2*n7_2;
	o7_8 = n1_2*n5_2*n9_4 - n1_2*n6_3*n8_3 - n2_2*n4_2*n9_4 + n2_2*n6_3*n7_3 + n3_3*n4_2*n8_3 - n3_3*n5_2*n7_3;

	Eigen::Matrix<floatPrec,9,1> coeff(9);
	coeff[0] = o7_0;
	coeff[1] = o7_1;
	coeff[2] = o7_2;
	coeff[3] = o7_3;
	coeff[4] = o7_4;
	coeff[5] = o7_5;
	coeff[6] = o7_6;
	coeff[7] = o7_7;
	coeff[8] = o7_8;

	std::vector<floatPrec> calc_realRoots;
	Eigen::PolynomialSolver<floatPrec, Eigen::Dynamic> solver;
    unsigned int numHyp = 0;
	if(coeff[coeff.size()-1] != floatPrec(0.0)){
		// std::cout << coeff.transpose() << std::endl;
		solver.compute(coeff);
		solver.realRoots(calc_realRoots);    
		numHyp = calc_realRoots.size();
	}
	else{
		return out;
	}

	floatPrec x, y, z;
	floatPrec r11, r12, r13, r21, r22, r23, r31, r32, r33, r_;

	Matrix<floatPrec, 4,4> TP;
	for(unsigned int i = 0; i < numHyp; i++){

		TP.setIdentity(4,4);

		x = calc_realRoots[i];
		y = (n2_0*n6_0 + n2_0*n6_1*x + n2_0*n6_2*x*x + n2_0*n6_3*x*x*x + n2_1*n6_0*x + n2_1*n6_1*x*x + n2_1*n6_2*x*x*x + n2_1*n6_3*x*x*x*x + n2_2*n6_0*x*x + n2_2*n6_1*x*x*x + n2_2*n6_2*x*x*x*x + n2_2*n6_3*x*x*x*x*x - n3_0*n5_0 - n3_0*n5_1*x - n3_0*n5_2*x*x - n3_1*n5_0*x - n3_1*n5_1*x*x - n3_1*n5_2*x*x*x - n3_2*n5_0*x*x - n3_2*n5_1*x*x*x - n3_2*n5_2*x*x*x*x - n3_3*n5_0*x*x*x - n3_3*n5_1*x*x*x*x - n3_3*n5_2*x*x*x*x*x)/(n1_0*n5_0 + n1_0*n5_1*x + n1_0*n5_2*x*x + n1_1*n5_0*x + n1_1*n5_1*x*x + n1_1*n5_2*x*x*x + n1_2*n5_0*x*x + n1_2*n5_1*x*x*x + n1_2*n5_2*x*x*x*x - n2_0*n4_0 - n2_0*n4_1*x - n2_0*n4_2*x*x - n2_1*n4_0*x - n2_1*n4_1*x*x - n2_1*n4_2*x*x*x - n2_2*n4_0*x*x - n2_2*n4_1*x*x*x - n2_2*n4_2*x*x*x*x);
		z = (-n1_0*n6_0 - n1_0*n6_1*x - n1_0*n6_2*x*x - n1_0*n6_3*x*x*x - n1_1*n6_0*x - n1_1*n6_1*x*x - n1_1*n6_2*x*x*x - n1_1*n6_3*x*x*x*x - n1_2*n6_0*x*x - n1_2*n6_1*x*x*x - n1_2*n6_2*x*x*x*x - n1_2*n6_3*x*x*x*x*x + n3_0*n4_0 + n3_0*n4_1*x + n3_0*n4_2*x*x + n3_1*n4_0*x + n3_1*n4_1*x*x + n3_1*n4_2*x*x*x + n3_2*n4_0*x*x + n3_2*n4_1*x*x*x + n3_2*n4_2*x*x*x*x + n3_3*n4_0*x*x*x + n3_3*n4_1*x*x*x*x + n3_3*n4_2*x*x*x*x*x)/(n1_0*n5_0 + n1_0*n5_1*x + n1_0*n5_2*x*x + n1_1*n5_0*x + n1_1*n5_1*x*x + n1_1*n5_2*x*x*x + n1_2*n5_0*x*x + n1_2*n5_1*x*x*x + n1_2*n5_2*x*x*x*x - n2_0*n4_0 - n2_0*n4_1*x - n2_0*n4_2*x*x - n2_1*n4_0*x - n2_1*n4_1*x*x - n2_1*n4_2*x*x*x - n2_2*n4_0*x*x - n2_2*n4_1*x*x*x - n2_2*n4_2*x*x*x*x);

		r_  = 1 + x*x + y*y + z*z;
		r11 = 1 + x*x - y*y - z*z; r11 /= r_;
		r12 = 2*x*y - 2*z; r12 /= r_;
		r13 = 2*y + 2*x*z; r13 /= r_;
		r21 = 2*x*y + 2*z; r21 /= r_;
		r22 = 1 - x*x + y*y - z*z; r22 /= r_;
		r23 = 2*y*z - 2*x; r23 /= r_;
		r31 = 2*x*z - 2*y; r31 /= r_;
		r32 = 2*x + 2*y*z;  r32 /= r_;
		r33 = 1 - x*x - y*y + z*z; r33 /= r_;

		TP.topLeftCorner(3, 3) << r11, r12, r13, r21, r22, r23, r31, r32, r33;
		Matrix<floatPrec, 4,4> outi = TV.inverse() * TP * TU;

		out.push_back(outi);

	}

	return out;
}